

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_fma::forward
          (Convolution1D_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  size_t sVar8;
  void *pvVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  int *piVar24;
  void *pvVar25;
  int iVar26;
  uint _h;
  int iVar27;
  long lVar28;
  float *pfVar29;
  uint uVar30;
  undefined4 *puVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  float *pfVar35;
  uint *puVar36;
  int iVar37;
  undefined4 *puVar38;
  ulong uVar39;
  uint *puVar40;
  undefined1 (*pauVar41) [32];
  undefined1 (*pauVar42) [16];
  float *pfVar43;
  long lVar44;
  undefined1 (*pauVar45) [32];
  ulong uVar46;
  undefined1 (*pauVar47) [32];
  float *pfVar48;
  uint *puVar49;
  int iVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [32];
  undefined1 (*pauVar53) [16];
  long lVar54;
  bool bVar55;
  float fVar56;
  float fVar57;
  __m128 one;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [28];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar240;
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar242 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar455 [16];
  float fVar479;
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  float fVar480;
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  float fVar478;
  undefined1 auVar476 [64];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar477 [64];
  ulong local_100;
  uint local_c8;
  Mat local_a8;
  long local_60;
  void *local_58;
  void *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  undefined1 auVar138 [32];
  undefined1 auVar144 [32];
  undefined1 auVar151 [32];
  undefined1 auVar224 [32];
  undefined1 auVar235 [32];
  undefined1 auVar270 [32];
  
  uVar46 = bottom_blob->elemsize;
  uVar3 = bottom_blob->elempack;
  p_Var5 = this->_vptr_Convolution1D_x86_fma[-3];
  iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var5);
  local_a8.cstep = 0;
  local_a8.data = (Allocator *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize._0_4_ = 0;
  local_a8.elempack = 0;
  local_a8.elemsize._4_4_ = (int)local_a8.refcount;
  local_a8.allocator = (Allocator *)local_a8.data;
  local_a8.dims = (int)local_a8.refcount;
  local_a8.w = local_a8.refcount._4_4_;
  local_a8.h = (uint)local_a8.elemsize;
  local_a8.d = (int)local_a8.refcount;
  local_a8.c = local_a8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86_fma + (long)this->_vptr_Convolution1D_x86_fma[-3]
             ),bottom_blob,&local_a8,opt);
  iVar26 = local_a8.h;
  iVar50 = -100;
  if (((Allocator *)local_a8.data != (Allocator *)0x0) && ((long)local_a8.c * local_a8.cstep != 0))
  {
    lVar44 = 1;
    if (opt->use_packing_layout == true) {
      lVar44 = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]) & 7) != 0) {
        lVar44 = (ulong)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3])
                         & 3) == 0) * 3 + 1;
      }
    }
    uVar51 = (ulong)(uint)local_a8.h;
    uVar33 = (uint)lVar44;
    iVar4 = (local_a8.w + ~((iVar4 + -1) * iVar37)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_fma[-3]);
    local_38 = (ulong)(iVar4 + 1U);
    _h = *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]) / (int)uVar33;
    Mat::create(top_blob,iVar4 + 1U,_h,lVar44 * (uVar46 / (ulong)(long)(int)uVar3),uVar33,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar32 = uVar3 ^ 8;
      local_c8 = uVar33 ^ 8;
      if ((uVar33 == 8 && uVar32 == 0) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        local_100 = 0;
        auVar331 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar379 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar324 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar147._8_4_ = 0x3f318000;
        auVar147._0_8_ = 0x3f3180003f318000;
        auVar147._12_4_ = 0x3f318000;
        auVar147._16_4_ = 0x3f318000;
        auVar147._20_4_ = 0x3f318000;
        auVar147._24_4_ = 0x3f318000;
        auVar147._28_4_ = 0x3f318000;
        do {
          if (-1 < iVar4) {
            pauVar45 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_100 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86_fma;
            iVar50 = 0;
            iVar37 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar476 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar476 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var5) +
                                     local_100 * 0x20));
              }
              if (iVar26 < 1) {
                auVar154 = ZEXT3264(auVar476._0_32_);
              }
              else {
                pauVar52 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * local_100 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                puVar38 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_a8.data + 0x18))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar50) * 4 + 4);
                uVar46 = 0;
                do {
                  if (*(int *)(&this->field_0xd4 + (long)p_Var5) < 1) {
                    auVar154 = ZEXT3264(auVar476._0_32_);
                  }
                  else {
                    puVar31 = puVar38;
                    iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      uVar1 = puVar31[-7];
                      auVar141._4_4_ = uVar1;
                      auVar141._0_4_ = uVar1;
                      auVar141._8_4_ = uVar1;
                      auVar141._12_4_ = uVar1;
                      auVar141._16_4_ = uVar1;
                      auVar141._20_4_ = uVar1;
                      auVar141._24_4_ = uVar1;
                      auVar141._28_4_ = uVar1;
                      uVar1 = puVar31[-6];
                      auVar143._4_4_ = uVar1;
                      auVar143._0_4_ = uVar1;
                      auVar143._8_4_ = uVar1;
                      auVar143._12_4_ = uVar1;
                      auVar143._16_4_ = uVar1;
                      auVar143._20_4_ = uVar1;
                      auVar143._24_4_ = uVar1;
                      auVar143._28_4_ = uVar1;
                      uVar1 = puVar31[-5];
                      auVar137._4_4_ = uVar1;
                      auVar137._0_4_ = uVar1;
                      auVar137._8_4_ = uVar1;
                      auVar137._12_4_ = uVar1;
                      auVar137._16_4_ = uVar1;
                      auVar137._20_4_ = uVar1;
                      auVar137._24_4_ = uVar1;
                      auVar137._28_4_ = uVar1;
                      uVar1 = puVar31[-4];
                      auVar150._4_4_ = uVar1;
                      auVar150._0_4_ = uVar1;
                      auVar150._8_4_ = uVar1;
                      auVar150._12_4_ = uVar1;
                      auVar150._16_4_ = uVar1;
                      auVar150._20_4_ = uVar1;
                      auVar150._24_4_ = uVar1;
                      auVar150._28_4_ = uVar1;
                      uVar1 = puVar31[-3];
                      auVar220._4_4_ = uVar1;
                      auVar220._0_4_ = uVar1;
                      auVar220._8_4_ = uVar1;
                      auVar220._12_4_ = uVar1;
                      auVar220._16_4_ = uVar1;
                      auVar220._20_4_ = uVar1;
                      auVar220._24_4_ = uVar1;
                      auVar220._28_4_ = uVar1;
                      uVar1 = puVar31[-2];
                      auVar230._4_4_ = uVar1;
                      auVar230._0_4_ = uVar1;
                      auVar230._8_4_ = uVar1;
                      auVar230._12_4_ = uVar1;
                      auVar230._16_4_ = uVar1;
                      auVar230._20_4_ = uVar1;
                      auVar230._24_4_ = uVar1;
                      auVar230._28_4_ = uVar1;
                      uVar1 = puVar31[-1];
                      auVar441._4_4_ = uVar1;
                      auVar441._0_4_ = uVar1;
                      auVar441._8_4_ = uVar1;
                      auVar441._12_4_ = uVar1;
                      auVar441._16_4_ = uVar1;
                      auVar441._20_4_ = uVar1;
                      auVar441._24_4_ = uVar1;
                      auVar441._28_4_ = uVar1;
                      uVar1 = *puVar31;
                      auVar447._4_4_ = uVar1;
                      auVar447._0_4_ = uVar1;
                      auVar447._8_4_ = uVar1;
                      auVar447._12_4_ = uVar1;
                      auVar447._16_4_ = uVar1;
                      auVar447._20_4_ = uVar1;
                      auVar447._24_4_ = uVar1;
                      auVar447._28_4_ = uVar1;
                      auVar241 = vfmadd132ps_fma(auVar141,auVar476._0_32_,*pauVar52);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar143,pauVar52[1]);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar137,pauVar52[2]);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar150,pauVar52[3]);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar220,pauVar52[4]);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar230,pauVar52[5]);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar441,pauVar52[6]);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar447,pauVar52[7]);
                      auVar154 = ZEXT1664(auVar241);
                      pauVar52 = pauVar52 + 8;
                      puVar31 = puVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 3);
                      auVar476 = ZEXT1664(auVar241);
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar46 = uVar46 + 1;
                  puVar38 = (undefined4 *)
                            ((long)puVar38 +
                            (long)local_a8.w *
                            CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                  auVar476 = ZEXT3264(auVar154._0_32_);
                } while (uVar46 != uVar51);
              }
              auVar141 = auVar154._0_32_;
              p_Var5 = pp_Var6[-3];
              auVar137 = auVar331._0_32_;
              auVar143 = auVar324._0_32_;
              auVar150 = auVar379._0_32_;
              auVar476._28_36_ = auVar154._28_36_;
              fVar57 = auVar324._0_4_;
              fVar56 = auVar324._4_4_;
              fVar480 = auVar324._8_4_;
              fVar2 = auVar324._12_4_;
              fVar240 = auVar324._16_4_;
              fVar478 = auVar324._20_4_;
              fVar479 = auVar324._24_4_;
              fVar10 = auVar324._28_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar141 = vmaxps_avx(auVar141,auVar137);
                break;
              case 2:
                auVar143 = vmaxps_avx(auVar141,auVar137);
                auVar141 = vminps_avx(auVar141,auVar137);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar140._4_4_ = uVar1;
                auVar140._0_4_ = uVar1;
                auVar140._8_4_ = uVar1;
                auVar140._12_4_ = uVar1;
                auVar140._16_4_ = uVar1;
                auVar140._20_4_ = uVar1;
                auVar140._24_4_ = uVar1;
                auVar140._28_4_ = uVar1;
                auVar241 = vfmadd213ps_fma(auVar140,auVar141,auVar143);
                auVar141 = ZEXT1632(auVar241);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar213._4_4_ = uVar1;
                auVar213._0_4_ = uVar1;
                auVar213._8_4_ = uVar1;
                auVar213._12_4_ = uVar1;
                auVar213._16_4_ = uVar1;
                auVar213._20_4_ = uVar1;
                auVar213._24_4_ = uVar1;
                auVar213._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar470._4_4_ = uVar1;
                auVar470._0_4_ = uVar1;
                auVar470._8_4_ = uVar1;
                auVar470._12_4_ = uVar1;
                auVar470._16_4_ = uVar1;
                auVar470._20_4_ = uVar1;
                auVar470._24_4_ = uVar1;
                auVar470._28_4_ = uVar1;
                auVar141 = vmaxps_avx(auVar141,auVar213);
                auVar141 = vminps_avx(auVar470,auVar141);
                break;
              case 4:
                auVar136._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
                auVar136._8_4_ = -auVar154._8_4_;
                auVar136._12_4_ = -auVar154._12_4_;
                auVar136._16_4_ = -auVar154._16_4_;
                auVar136._20_4_ = -auVar154._20_4_;
                auVar136._24_4_ = -auVar154._24_4_;
                auVar136._28_4_ = auVar154._28_4_ ^ 0x80000000;
                auVar214._8_4_ = 0x42b0c0a5;
                auVar214._0_8_ = 0x42b0c0a542b0c0a5;
                auVar214._12_4_ = 0x42b0c0a5;
                auVar214._16_4_ = 0x42b0c0a5;
                auVar214._20_4_ = 0x42b0c0a5;
                auVar214._24_4_ = 0x42b0c0a5;
                auVar214._28_4_ = 0x42b0c0a5;
                auVar141 = vminps_avx(auVar136,auVar214);
                auVar215._8_4_ = 0xc2b0c0a5;
                auVar215._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar215._12_4_ = 0xc2b0c0a5;
                auVar215._16_4_ = 0xc2b0c0a5;
                auVar215._20_4_ = 0xc2b0c0a5;
                auVar215._24_4_ = 0xc2b0c0a5;
                auVar215._28_4_ = 0xc2b0c0a5;
                auVar137 = vmaxps_avx(auVar141,auVar215);
                auVar216._8_4_ = 0x3fb8aa3b;
                auVar216._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar216._12_4_ = 0x3fb8aa3b;
                auVar216._16_4_ = 0x3fb8aa3b;
                auVar216._20_4_ = 0x3fb8aa3b;
                auVar216._24_4_ = 0x3fb8aa3b;
                auVar216._28_4_ = 0x3fb8aa3b;
                auVar241 = vfmadd213ps_fma(auVar216,auVar137,auVar150);
                auVar220 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar141 = vcmpps_avx(ZEXT1632(auVar241),auVar220,1);
                auVar141 = vandps_avx(auVar141,auVar143);
                auVar141 = vsubps_avx(auVar220,auVar141);
                auVar83._8_4_ = 0x3f318000;
                auVar83._0_8_ = 0x3f3180003f318000;
                auVar83._12_4_ = 0x3f318000;
                auVar83._16_4_ = 0x3f318000;
                auVar83._20_4_ = 0x3f318000;
                auVar83._24_4_ = 0x3f318000;
                auVar83._28_4_ = 0x3f318000;
                auVar241 = vfmsub231ps_fma(auVar137,auVar141,auVar83);
                auVar257._8_4_ = 0x395e8083;
                auVar257._0_8_ = 0x395e8083395e8083;
                auVar257._12_4_ = 0x395e8083;
                auVar257._16_4_ = 0x395e8083;
                auVar257._20_4_ = 0x395e8083;
                auVar257._24_4_ = 0x395e8083;
                auVar257._28_4_ = 0x395e8083;
                auVar402 = vfmsub231ps_fma(ZEXT1632(auVar241),auVar141,auVar257);
                auVar137 = ZEXT1632(auVar402);
                auVar14._28_4_ = auVar220._28_4_;
                auVar14._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar417._8_4_ = 0x39506967;
                auVar417._0_8_ = 0x3950696739506967;
                auVar417._12_4_ = 0x39506967;
                auVar417._16_4_ = 0x39506967;
                auVar417._20_4_ = 0x39506967;
                auVar417._24_4_ = 0x39506967;
                auVar417._28_4_ = 0x39506967;
                auVar258._8_4_ = 0x3ab743ce;
                auVar258._0_8_ = 0x3ab743ce3ab743ce;
                auVar258._12_4_ = 0x3ab743ce;
                auVar258._16_4_ = 0x3ab743ce;
                auVar258._20_4_ = 0x3ab743ce;
                auVar258._24_4_ = 0x3ab743ce;
                auVar258._28_4_ = 0x3ab743ce;
                auVar241 = vfmadd213ps_fma(auVar417,auVar137,auVar258);
                auVar84._8_4_ = 0x3c088908;
                auVar84._0_8_ = 0x3c0889083c088908;
                auVar84._12_4_ = 0x3c088908;
                auVar84._16_4_ = 0x3c088908;
                auVar84._20_4_ = 0x3c088908;
                auVar84._24_4_ = 0x3c088908;
                auVar84._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar84);
                auVar85._8_4_ = 0x3d2aa9c1;
                auVar85._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar85._12_4_ = 0x3d2aa9c1;
                auVar85._16_4_ = 0x3d2aa9c1;
                auVar85._20_4_ = 0x3d2aa9c1;
                auVar85._24_4_ = 0x3d2aa9c1;
                auVar85._28_4_ = 0x3d2aa9c1;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar85);
                auVar86._8_4_ = 0x3e2aaaaa;
                auVar86._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar86._12_4_ = 0x3e2aaaaa;
                auVar86._16_4_ = 0x3e2aaaaa;
                auVar86._20_4_ = 0x3e2aaaaa;
                auVar86._24_4_ = 0x3e2aaaaa;
                auVar86._28_4_ = 0x3e2aaaaa;
                auVar137 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar86);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar150);
                auVar335 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar14,auVar137);
                auVar105._0_4_ = (int)auVar141._0_4_;
                auVar105._4_4_ = (int)auVar141._4_4_;
                auVar105._8_4_ = (int)auVar141._8_4_;
                auVar105._12_4_ = (int)auVar141._12_4_;
                auVar138._16_4_ = (int)auVar141._16_4_;
                auVar138._0_16_ = auVar105;
                auVar138._20_4_ = (int)auVar141._20_4_;
                auVar138._24_4_ = (int)auVar141._24_4_;
                auVar138._28_4_ = (int)auVar141._28_4_;
                auVar402 = vpslld_avx(auVar105,0x17);
                auVar241 = vpslld_avx(auVar138._16_16_,0x17);
                auVar58._8_4_ = 0x3f800000;
                auVar58._0_8_ = 0x3f8000003f800000;
                auVar58._12_4_ = 0x3f800000;
                auVar241 = vpaddd_avx(auVar241,auVar58);
                auVar402 = vpaddd_avx(auVar402,auVar58);
                auVar139._16_16_ = auVar241;
                auVar139._0_16_ = auVar402;
                auVar217._0_4_ = auVar335._0_4_ + fVar57;
                auVar217._4_4_ = auVar335._4_4_ + fVar56;
                auVar217._8_4_ = auVar335._8_4_ + fVar480;
                auVar217._12_4_ = auVar335._12_4_ + fVar2;
                auVar217._16_4_ = fVar240 + 0.0;
                auVar217._20_4_ = fVar478 + 0.0;
                auVar217._24_4_ = fVar479 + 0.0;
                auVar217._28_4_ = fVar10 + 0.0;
                auVar241 = vfmadd213ps_fma(auVar139,auVar217,auVar143);
                auVar141 = vrcpps_avx(ZEXT1632(auVar241));
                auVar241 = vfmsub213ps_fma(ZEXT1632(auVar241),auVar141,auVar143);
                auVar241 = vfnmadd132ps_fma(ZEXT1632(auVar241),auVar141,auVar141);
                auVar141 = ZEXT1632(auVar241);
                break;
              case 5:
                auVar442._8_4_ = 0x42b0c0a5;
                auVar442._0_8_ = 0x42b0c0a542b0c0a5;
                auVar442._12_4_ = 0x42b0c0a5;
                auVar442._16_4_ = 0x42b0c0a5;
                auVar442._20_4_ = 0x42b0c0a5;
                auVar442._24_4_ = 0x42b0c0a5;
                auVar442._28_4_ = 0x42b0c0a5;
                auVar141 = vminps_avx(auVar442,auVar141);
                auVar448._8_4_ = 0xc2b0c0a5;
                auVar448._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar448._12_4_ = 0xc2b0c0a5;
                auVar448._16_4_ = 0xc2b0c0a5;
                auVar448._20_4_ = 0xc2b0c0a5;
                auVar448._24_4_ = 0xc2b0c0a5;
                auVar448._28_4_ = 0xc2b0c0a5;
                auVar137 = vmaxps_avx(auVar448,auVar141);
                auVar414._8_4_ = 0x3fb8aa3b;
                auVar414._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar414._12_4_ = 0x3fb8aa3b;
                auVar414._16_4_ = 0x3fb8aa3b;
                auVar414._20_4_ = 0x3fb8aa3b;
                auVar414._24_4_ = 0x3fb8aa3b;
                auVar414._28_4_ = 0x3fb8aa3b;
                auVar241 = vfmadd213ps_fma(auVar414,auVar137,auVar150);
                auVar220 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar141 = vcmpps_avx(ZEXT1632(auVar241),auVar220,1);
                auVar141 = vandps_avx(auVar141,auVar143);
                auVar141 = vsubps_avx(auVar220,auVar141);
                auVar241 = vfmsub231ps_fma(auVar137,auVar141,auVar147);
                auVar449._8_4_ = 0xb95e8083;
                auVar449._0_8_ = 0xb95e8083b95e8083;
                auVar449._12_4_ = 0xb95e8083;
                auVar449._16_4_ = 0xb95e8083;
                auVar449._20_4_ = 0xb95e8083;
                auVar449._24_4_ = 0xb95e8083;
                auVar449._28_4_ = 0xb95e8083;
                auVar402 = vfnmsub231ps_fma(ZEXT1632(auVar241),auVar141,auVar449);
                auVar137 = ZEXT1632(auVar402);
                auVar11._28_4_ = auVar220._28_4_;
                auVar11._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar328._8_4_ = 0x39506967;
                auVar328._0_8_ = 0x3950696739506967;
                auVar328._12_4_ = 0x39506967;
                auVar328._16_4_ = 0x39506967;
                auVar328._20_4_ = 0x39506967;
                auVar328._24_4_ = 0x39506967;
                auVar328._28_4_ = 0x39506967;
                auVar453._8_4_ = 0x3ab743ce;
                auVar453._0_8_ = 0x3ab743ce3ab743ce;
                auVar453._12_4_ = 0x3ab743ce;
                auVar453._16_4_ = 0x3ab743ce;
                auVar453._20_4_ = 0x3ab743ce;
                auVar453._24_4_ = 0x3ab743ce;
                auVar453._28_4_ = 0x3ab743ce;
                auVar241 = vfmadd213ps_fma(auVar328,auVar137,auVar453);
                auVar305._8_4_ = 0x3c088908;
                auVar305._0_8_ = 0x3c0889083c088908;
                auVar305._12_4_ = 0x3c088908;
                auVar305._16_4_ = 0x3c088908;
                auVar305._20_4_ = 0x3c088908;
                auVar305._24_4_ = 0x3c088908;
                auVar305._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar305);
                auVar454._8_4_ = 0x3d2aa9c1;
                auVar454._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar454._12_4_ = 0x3d2aa9c1;
                auVar454._16_4_ = 0x3d2aa9c1;
                auVar454._20_4_ = 0x3d2aa9c1;
                auVar454._24_4_ = 0x3d2aa9c1;
                auVar454._28_4_ = 0x3d2aa9c1;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar454);
                auVar443._8_4_ = 0x3e2aaaaa;
                auVar443._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar443._12_4_ = 0x3e2aaaaa;
                auVar443._16_4_ = 0x3e2aaaaa;
                auVar443._20_4_ = 0x3e2aaaaa;
                auVar443._24_4_ = 0x3e2aaaaa;
                auVar443._28_4_ = 0x3e2aaaaa;
                auVar137 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar443);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar150);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar11,auVar137);
                auVar207._0_4_ = auVar241._0_4_ + fVar57;
                auVar207._4_4_ = auVar241._4_4_ + fVar56;
                auVar207._8_4_ = auVar241._8_4_ + fVar480;
                auVar207._12_4_ = auVar241._12_4_ + fVar2;
                auVar207._16_4_ = fVar240 + 0.0;
                auVar207._20_4_ = fVar478 + 0.0;
                auVar207._24_4_ = fVar479 + 0.0;
                auVar207._28_4_ = fVar10 + 0.0;
                auVar402._0_4_ = (int)auVar141._0_4_;
                auVar402._4_4_ = (int)auVar141._4_4_;
                auVar402._8_4_ = (int)auVar141._8_4_;
                auVar402._12_4_ = (int)auVar141._12_4_;
                auVar250._16_4_ = (int)auVar141._16_4_;
                auVar250._0_16_ = auVar402;
                auVar250._20_4_ = (int)auVar141._20_4_;
                auVar250._24_4_ = (int)auVar141._24_4_;
                auVar250._28_4_ = (int)auVar141._28_4_;
                auVar402 = vpslld_avx(auVar402,0x17);
                auVar241 = vpslld_avx(auVar250._16_16_,0x17);
                auVar121._8_4_ = 0x3f800000;
                auVar121._0_8_ = 0x3f8000003f800000;
                auVar121._12_4_ = 0x3f800000;
                auVar241 = vpaddd_avx(auVar241,auVar121);
                auVar402 = vpaddd_avx(auVar402,auVar121);
                auVar469._16_16_ = auVar241;
                auVar469._0_16_ = auVar402;
                auVar335 = vfmadd213ps_fma(auVar469,auVar207,auVar143);
                auVar208._8_4_ = 0x800000;
                auVar208._0_8_ = 0x80000000800000;
                auVar208._12_4_ = 0x800000;
                auVar208._16_4_ = 0x800000;
                auVar208._20_4_ = 0x800000;
                auVar208._24_4_ = 0x800000;
                auVar208._28_4_ = 0x800000;
                auVar141 = vmaxps_avx(ZEXT1632(auVar335),auVar208);
                auVar402 = vpsrld_avx(auVar141._0_16_,0x17);
                auVar241 = vpsrld_avx(auVar141._16_16_,0x17);
                auVar316._8_4_ = 0x807fffff;
                auVar316._0_8_ = 0x807fffff807fffff;
                auVar316._12_4_ = 0x807fffff;
                auVar316._16_4_ = 0x807fffff;
                auVar316._20_4_ = 0x807fffff;
                auVar316._24_4_ = 0x807fffff;
                auVar316._28_4_ = 0x807fffff;
                auVar141 = vandps_avx(auVar141,auVar316);
                auVar220 = vorps_avx(auVar150,auVar141);
                auVar317._8_4_ = 0x3f3504f3;
                auVar317._0_8_ = 0x3f3504f33f3504f3;
                auVar317._12_4_ = 0x3f3504f3;
                auVar317._16_4_ = 0x3f3504f3;
                auVar317._20_4_ = 0x3f3504f3;
                auVar317._24_4_ = 0x3f3504f3;
                auVar317._28_4_ = 0x3f3504f3;
                auVar137 = vcmpps_avx(auVar317,auVar220,2);
                auVar141 = vandnps_avx(auVar137,auVar220);
                auVar444._8_4_ = 0xbf800000;
                auVar444._0_8_ = 0xbf800000bf800000;
                auVar444._12_4_ = 0xbf800000;
                auVar444._16_4_ = 0xbf800000;
                auVar444._20_4_ = 0xbf800000;
                auVar444._24_4_ = 0xbf800000;
                auVar444._28_4_ = 0xbf800000;
                auVar209._0_4_ = auVar141._0_4_ + auVar220._0_4_ + -1.0;
                auVar209._4_4_ = auVar141._4_4_ + auVar220._4_4_ + -1.0;
                auVar209._8_4_ = auVar141._8_4_ + auVar220._8_4_ + -1.0;
                auVar209._12_4_ = auVar141._12_4_ + auVar220._12_4_ + -1.0;
                auVar209._16_4_ = auVar141._16_4_ + auVar220._16_4_ + -1.0;
                auVar209._20_4_ = auVar141._20_4_ + auVar220._20_4_ + -1.0;
                auVar209._24_4_ = auVar141._24_4_ + auVar220._24_4_ + -1.0;
                auVar209._28_4_ = auVar141._28_4_ + auVar220._28_4_ + -1.0;
                auVar241 = vpsubd_avx(auVar241,auVar137._16_16_);
                auVar341._8_4_ = 0xffffff81;
                auVar341._0_8_ = 0xffffff81ffffff81;
                auVar341._12_4_ = 0xffffff81;
                auVar241 = vpaddd_avx(auVar241,auVar341);
                auVar402 = vpsubd_avx(auVar402,auVar137._0_16_);
                auVar402 = vpaddd_avx(auVar341,auVar402);
                auVar251._16_16_ = auVar241;
                auVar251._0_16_ = auVar402;
                auVar12._4_4_ = auVar209._4_4_ * auVar209._4_4_;
                auVar12._0_4_ = auVar209._0_4_ * auVar209._0_4_;
                auVar12._8_4_ = auVar209._8_4_ * auVar209._8_4_;
                auVar12._12_4_ = auVar209._12_4_ * auVar209._12_4_;
                auVar12._16_4_ = auVar209._16_4_ * auVar209._16_4_;
                auVar12._20_4_ = auVar209._20_4_ * auVar209._20_4_;
                auVar12._24_4_ = auVar209._24_4_ * auVar209._24_4_;
                auVar12._28_4_ = auVar137._28_4_;
                auVar415._8_4_ = 0x3d9021bb;
                auVar415._0_8_ = 0x3d9021bb3d9021bb;
                auVar415._12_4_ = 0x3d9021bb;
                auVar415._16_4_ = 0x3d9021bb;
                auVar415._20_4_ = 0x3d9021bb;
                auVar415._24_4_ = 0x3d9021bb;
                auVar415._28_4_ = 0x3d9021bb;
                auVar349._8_4_ = 0xbdebd1b8;
                auVar349._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar349._12_4_ = 0xbdebd1b8;
                auVar349._16_4_ = 0xbdebd1b8;
                auVar349._20_4_ = 0xbdebd1b8;
                auVar349._24_4_ = 0xbdebd1b8;
                auVar349._28_4_ = 0xbdebd1b8;
                auVar241 = vfmadd213ps_fma(auVar415,auVar209,auVar349);
                auVar350._8_4_ = 0x3def251a;
                auVar350._0_8_ = 0x3def251a3def251a;
                auVar350._12_4_ = 0x3def251a;
                auVar350._16_4_ = 0x3def251a;
                auVar350._20_4_ = 0x3def251a;
                auVar350._24_4_ = 0x3def251a;
                auVar350._28_4_ = 0x3def251a;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar209,auVar350);
                auVar351._8_4_ = 0xbdfe5d4f;
                auVar351._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar351._12_4_ = 0xbdfe5d4f;
                auVar351._16_4_ = 0xbdfe5d4f;
                auVar351._20_4_ = 0xbdfe5d4f;
                auVar351._24_4_ = 0xbdfe5d4f;
                auVar351._28_4_ = 0xbdfe5d4f;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar209,auVar351);
                auVar352._8_4_ = 0x3e11e9bf;
                auVar352._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar352._12_4_ = 0x3e11e9bf;
                auVar352._16_4_ = 0x3e11e9bf;
                auVar352._20_4_ = 0x3e11e9bf;
                auVar352._24_4_ = 0x3e11e9bf;
                auVar352._28_4_ = 0x3e11e9bf;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar209,auVar352);
                auVar353._8_4_ = 0xbe2aae50;
                auVar353._0_8_ = 0xbe2aae50be2aae50;
                auVar353._12_4_ = 0xbe2aae50;
                auVar353._16_4_ = 0xbe2aae50;
                auVar353._20_4_ = 0xbe2aae50;
                auVar353._24_4_ = 0xbe2aae50;
                auVar353._28_4_ = 0xbe2aae50;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar209,auVar353);
                auVar354._8_4_ = 0x3e4cceac;
                auVar354._0_8_ = 0x3e4cceac3e4cceac;
                auVar354._12_4_ = 0x3e4cceac;
                auVar354._16_4_ = 0x3e4cceac;
                auVar354._20_4_ = 0x3e4cceac;
                auVar354._24_4_ = 0x3e4cceac;
                auVar354._28_4_ = 0x3e4cceac;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar209,auVar354);
                auVar355._8_4_ = 0xbe7ffffc;
                auVar355._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar355._12_4_ = 0xbe7ffffc;
                auVar355._16_4_ = 0xbe7ffffc;
                auVar355._20_4_ = 0xbe7ffffc;
                auVar355._24_4_ = 0xbe7ffffc;
                auVar355._28_4_ = 0xbe7ffffc;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar209,auVar355);
                auVar356._8_4_ = 0x3eaaaaaa;
                auVar356._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar356._12_4_ = 0x3eaaaaaa;
                auVar356._16_4_ = 0x3eaaaaaa;
                auVar356._20_4_ = 0x3eaaaaaa;
                auVar356._24_4_ = 0x3eaaaaaa;
                auVar356._28_4_ = 0x3eaaaaaa;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar209,auVar356);
                auVar416._0_4_ = auVar209._0_4_ * auVar209._0_4_ * auVar209._0_4_ * auVar241._0_4_;
                auVar416._4_4_ = auVar209._4_4_ * auVar209._4_4_ * auVar209._4_4_ * auVar241._4_4_;
                auVar416._8_4_ = auVar209._8_4_ * auVar209._8_4_ * auVar209._8_4_ * auVar241._8_4_;
                auVar416._12_4_ =
                     auVar209._12_4_ * auVar209._12_4_ * auVar209._12_4_ * auVar241._12_4_;
                auVar416._16_4_ = auVar209._16_4_ * auVar209._16_4_ * auVar209._16_4_ * 0.0;
                auVar416._20_4_ = auVar209._20_4_ * auVar209._20_4_ * auVar209._20_4_ * 0.0;
                auVar416._24_4_ = auVar209._24_4_ * auVar209._24_4_ * auVar209._24_4_ * 0.0;
                auVar416._28_4_ = 0;
                auVar137 = vcvtdq2ps_avx(auVar251);
                auVar241 = vfmadd231ps_fma(auVar416,auVar137,auVar449);
                auVar241 = vfmsub231ps_fma(ZEXT1632(auVar241),auVar150,auVar12);
                auVar141 = vcmpps_avx(ZEXT1632(auVar335),_DAT_005537a0,2);
                auVar220 = vsubps_avx(ZEXT1632(auVar241),auVar209);
                auVar241 = vfmsub231ps_fma(auVar220,auVar147,auVar137);
                auVar431._8_4_ = 0xc0000000;
                auVar431._0_8_ = 0xc0000000c0000000;
                auVar431._12_4_ = 0xc0000000;
                auVar431._16_4_ = 0xc0000000;
                auVar431._20_4_ = 0xc0000000;
                auVar431._24_4_ = 0xc0000000;
                auVar431._28_4_ = 0xc0000000;
                auVar210._0_4_ = auVar241._0_4_ * -2.0;
                auVar210._4_4_ = auVar241._4_4_ * -2.0;
                auVar210._8_4_ = auVar241._8_4_ * -2.0;
                auVar210._12_4_ = auVar241._12_4_ * -2.0;
                auVar210._16_4_ = 0x80000000;
                auVar210._20_4_ = 0x80000000;
                auVar210._24_4_ = 0x80000000;
                auVar210._28_4_ = 0;
                auVar252._8_4_ = 0x7fffffff;
                auVar252._0_8_ = 0x7fffffff7fffffff;
                auVar252._12_4_ = 0x7fffffff;
                auVar252._16_4_ = 0x7fffffff;
                auVar252._20_4_ = 0x7fffffff;
                auVar252._24_4_ = 0x7fffffff;
                auVar252._28_4_ = 0x7fffffff;
                auVar141 = vblendvps_avx(auVar210,auVar252,auVar141);
                auVar253._8_4_ = 0x42b0c0a5;
                auVar253._0_8_ = 0x42b0c0a542b0c0a5;
                auVar253._12_4_ = 0x42b0c0a5;
                auVar253._16_4_ = 0x42b0c0a5;
                auVar253._20_4_ = 0x42b0c0a5;
                auVar253._24_4_ = 0x42b0c0a5;
                auVar253._28_4_ = 0x42b0c0a5;
                auVar141 = vminps_avx(auVar141,auVar253);
                auVar254._8_4_ = 0xc2b0c0a5;
                auVar254._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar254._12_4_ = 0xc2b0c0a5;
                auVar254._16_4_ = 0xc2b0c0a5;
                auVar254._20_4_ = 0xc2b0c0a5;
                auVar254._24_4_ = 0xc2b0c0a5;
                auVar254._28_4_ = 0xc2b0c0a5;
                auVar137 = vmaxps_avx(auVar141,auVar254);
                auVar255._8_4_ = 0x3fb8aa3b;
                auVar255._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar255._12_4_ = 0x3fb8aa3b;
                auVar255._16_4_ = 0x3fb8aa3b;
                auVar255._20_4_ = 0x3fb8aa3b;
                auVar255._24_4_ = 0x3fb8aa3b;
                auVar255._28_4_ = 0x3fb8aa3b;
                auVar241 = vfmadd213ps_fma(auVar255,auVar137,auVar150);
                auVar220 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar141 = vcmpps_avx(ZEXT1632(auVar241),auVar220,1);
                auVar141 = vandps_avx(auVar141,auVar143);
                auVar141 = vsubps_avx(auVar220,auVar141);
                auVar241 = vfmsub231ps_fma(auVar137,auVar141,auVar147);
                auVar402 = vfnmsub231ps_fma(ZEXT1632(auVar241),auVar141,auVar449);
                auVar137 = ZEXT1632(auVar402);
                auVar13._28_4_ = auVar220._28_4_;
                auVar13._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar331 = ZEXT864(0) << 0x20;
                auVar357._8_4_ = 0x3ab743ce;
                auVar357._0_8_ = 0x3ab743ce3ab743ce;
                auVar357._12_4_ = 0x3ab743ce;
                auVar357._16_4_ = 0x3ab743ce;
                auVar357._20_4_ = 0x3ab743ce;
                auVar357._24_4_ = 0x3ab743ce;
                auVar357._28_4_ = 0x3ab743ce;
                auVar241 = vfmadd213ps_fma(auVar328,auVar137,auVar357);
                auVar358._8_4_ = 0x3c088908;
                auVar358._0_8_ = 0x3c0889083c088908;
                auVar358._12_4_ = 0x3c088908;
                auVar358._16_4_ = 0x3c088908;
                auVar358._20_4_ = 0x3c088908;
                auVar358._24_4_ = 0x3c088908;
                auVar358._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar358);
                auVar379 = ZEXT3264(auVar150);
                auVar324 = ZEXT3264(auVar143);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar454);
                auVar82._8_4_ = 0x3e2aaaaa;
                auVar82._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar82._12_4_ = 0x3e2aaaaa;
                auVar82._16_4_ = 0x3e2aaaaa;
                auVar82._20_4_ = 0x3e2aaaaa;
                auVar82._24_4_ = 0x3e2aaaaa;
                auVar82._28_4_ = 0x3e2aaaaa;
                auVar137 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar82);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar150);
                auVar335 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar13,auVar137);
                auVar241._0_4_ = (int)auVar141._0_4_;
                auVar241._4_4_ = (int)auVar141._4_4_;
                auVar241._8_4_ = (int)auVar141._8_4_;
                auVar241._12_4_ = (int)auVar141._12_4_;
                auVar211._16_4_ = (int)auVar141._16_4_;
                auVar211._0_16_ = auVar241;
                auVar211._20_4_ = (int)auVar141._20_4_;
                auVar211._24_4_ = (int)auVar141._24_4_;
                auVar211._28_4_ = (int)auVar141._28_4_;
                auVar402 = vpslld_avx(auVar241,0x17);
                auVar241 = vpslld_avx(auVar211._16_16_,0x17);
                auVar241 = vpaddd_avx(auVar241,auVar121);
                auVar402 = vpaddd_avx(auVar402,auVar121);
                auVar212._16_16_ = auVar241;
                auVar212._0_16_ = auVar402;
                auVar256._0_4_ = auVar335._0_4_ + fVar57;
                auVar256._4_4_ = auVar335._4_4_ + fVar56;
                auVar256._8_4_ = auVar335._8_4_ + fVar480;
                auVar256._12_4_ = auVar335._12_4_ + fVar2;
                auVar256._16_4_ = fVar240 + 0.0;
                auVar256._20_4_ = fVar478 + 0.0;
                auVar256._24_4_ = fVar479 + 0.0;
                auVar256._28_4_ = fVar10 + 0.0;
                auVar241 = vfmadd213ps_fma(auVar212,auVar256,auVar143);
                auVar141 = vrcpps_avx(ZEXT1632(auVar241));
                auVar241 = vfmsub213ps_fma(ZEXT1632(auVar241),auVar141,auVar143);
                auVar241 = vfnmadd132ps_fma(ZEXT1632(auVar241),auVar141,auVar141);
                auVar241 = vfnmadd213ps_fma(ZEXT1632(auVar241),auVar431,auVar444);
                auVar206 = ZEXT1628(auVar241);
                goto LAB_0052d285;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar218._4_4_ = uVar1;
                auVar218._0_4_ = uVar1;
                auVar218._8_4_ = uVar1;
                auVar218._12_4_ = uVar1;
                auVar218._16_4_ = uVar1;
                auVar218._20_4_ = uVar1;
                auVar218._24_4_ = uVar1;
                auVar218._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar259._4_4_ = uVar1;
                auVar259._0_4_ = uVar1;
                auVar259._8_4_ = uVar1;
                auVar259._12_4_ = uVar1;
                auVar259._16_4_ = uVar1;
                auVar259._20_4_ = uVar1;
                auVar259._24_4_ = uVar1;
                auVar259._28_4_ = uVar1;
                auVar241 = vfmadd231ps_fma(auVar259,auVar141,auVar218);
                auVar141 = vmaxps_avx(ZEXT1632(auVar241),auVar137);
                auVar141 = vminps_avx(auVar141,auVar143);
                auVar206 = auVar141._0_28_;
LAB_0052d285:
                auVar476._0_4_ = auVar206._0_4_ * auVar154._0_4_;
                auVar476._4_4_ = auVar206._4_4_ * auVar154._4_4_;
                auVar476._8_4_ = auVar206._8_4_ * auVar154._8_4_;
                auVar476._12_4_ = auVar206._12_4_ * auVar154._12_4_;
                auVar476._16_4_ = auVar206._16_4_ * auVar154._16_4_;
                auVar476._20_4_ = auVar206._20_4_ * auVar154._20_4_;
                auVar476._24_4_ = auVar206._24_4_ * auVar154._24_4_;
                auVar141 = auVar476._0_32_;
              }
              *pauVar45 = auVar141;
              pauVar45 = pauVar45 + 1;
              iVar50 = iVar50 + 8;
              bVar55 = iVar37 != iVar4;
              iVar37 = iVar37 + 1;
            } while (bVar55);
          }
          local_100 = local_100 + 1;
        } while (local_100 != _h);
      }
      if ((uVar3 == 1 && local_c8 == 0) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        uVar46 = 0;
        auVar379 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar323._8_4_ = 0x3f000000;
        auVar323._0_8_ = 0x3f0000003f000000;
        auVar323._12_4_ = 0x3f000000;
        auVar323._16_4_ = 0x3f000000;
        auVar323._20_4_ = 0x3f000000;
        auVar323._24_4_ = 0x3f000000;
        auVar323._28_4_ = 0x3f000000;
        auVar476 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar324 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar331 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        do {
          if (-1 < iVar4) {
            pauVar45 = (undefined1 (*) [32])
                       ((long)top_blob->w * uVar46 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86_fma;
            iVar37 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar154 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar154 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var5) + uVar46 * 0x20))
                ;
              }
              if (0 < iVar26) {
                pauVar52 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * uVar46 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                puVar38 = (undefined4 *)
                          ((long)(_func_int ***)local_a8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar37) * 4);
                uVar34 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    puVar31 = puVar38;
                    iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      uVar1 = *puVar31;
                      auVar219._4_4_ = uVar1;
                      auVar219._0_4_ = uVar1;
                      auVar219._8_4_ = uVar1;
                      auVar219._12_4_ = uVar1;
                      auVar219._16_4_ = uVar1;
                      auVar219._20_4_ = uVar1;
                      auVar219._24_4_ = uVar1;
                      auVar219._28_4_ = uVar1;
                      auVar241 = vfmadd231ps_fma(auVar154._0_32_,auVar219,*pauVar52);
                      auVar154 = ZEXT1664(auVar241);
                      pauVar52 = pauVar52 + 1;
                      puVar31 = puVar31 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  uVar34 = uVar34 + 1;
                  puVar38 = (undefined4 *)
                            ((long)puVar38 +
                            (long)local_a8.w *
                            CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar34 != uVar51);
              }
              auVar147 = auVar154._0_32_;
              p_Var5 = pp_Var6[-3];
              auVar141 = auVar324._0_32_;
              auVar143 = auVar331._0_32_;
              auVar137 = auVar379._0_32_;
              auVar150 = auVar476._0_32_;
              fVar57 = auVar324._0_4_;
              fVar56 = auVar324._4_4_;
              fVar480 = auVar324._8_4_;
              fVar2 = auVar324._12_4_;
              fVar240 = auVar324._16_4_;
              fVar478 = auVar324._20_4_;
              fVar479 = auVar324._24_4_;
              fVar10 = auVar324._28_4_;
              auVar477._28_36_ = auVar154._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar147 = vmaxps_avx(auVar147,_DAT_005537a0);
                break;
              case 2:
                auVar141 = vmaxps_avx(auVar147,ZEXT1632(ZEXT816(0) << 0x40));
                auVar147 = vminps_avx(auVar147,ZEXT1632(ZEXT816(0) << 0x40));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar146._4_4_ = uVar1;
                auVar146._0_4_ = uVar1;
                auVar146._8_4_ = uVar1;
                auVar146._12_4_ = uVar1;
                auVar146._16_4_ = uVar1;
                auVar146._20_4_ = uVar1;
                auVar146._24_4_ = uVar1;
                auVar146._28_4_ = uVar1;
                auVar241 = vfmadd213ps_fma(auVar146,auVar147,auVar141);
                auVar147 = ZEXT1632(auVar241);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar226._4_4_ = uVar1;
                auVar226._0_4_ = uVar1;
                auVar226._8_4_ = uVar1;
                auVar226._12_4_ = uVar1;
                auVar226._16_4_ = uVar1;
                auVar226._20_4_ = uVar1;
                auVar226._24_4_ = uVar1;
                auVar226._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar473._4_4_ = uVar1;
                auVar473._0_4_ = uVar1;
                auVar473._8_4_ = uVar1;
                auVar473._12_4_ = uVar1;
                auVar473._16_4_ = uVar1;
                auVar473._20_4_ = uVar1;
                auVar473._24_4_ = uVar1;
                auVar473._28_4_ = uVar1;
                auVar147 = vmaxps_avx(auVar147,auVar226);
                auVar147 = vminps_avx(auVar473,auVar147);
                break;
              case 4:
                auVar142._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
                auVar142._8_4_ = -auVar154._8_4_;
                auVar142._12_4_ = -auVar154._12_4_;
                auVar142._16_4_ = -auVar154._16_4_;
                auVar142._20_4_ = -auVar154._20_4_;
                auVar142._24_4_ = -auVar154._24_4_;
                auVar142._28_4_ = auVar154._28_4_ ^ 0x80000000;
                auVar95._8_4_ = 0x42b0c0a5;
                auVar95._0_8_ = 0x42b0c0a542b0c0a5;
                auVar95._12_4_ = 0x42b0c0a5;
                auVar95._16_4_ = 0x42b0c0a5;
                auVar95._20_4_ = 0x42b0c0a5;
                auVar95._24_4_ = 0x42b0c0a5;
                auVar95._28_4_ = 0x42b0c0a5;
                auVar147 = vminps_avx(auVar142,auVar95);
                auVar137 = vmaxps_avx(auVar137,auVar147);
                auVar241 = vfmadd213ps_fma(auVar150,auVar137,auVar323);
                auVar150 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar147 = vcmpps_avx(ZEXT1632(auVar241),auVar150,1);
                auVar147 = vandps_avx(auVar147,auVar141);
                auVar147 = vsubps_avx(auVar150,auVar147);
                auVar96._8_4_ = 0x3f318000;
                auVar96._0_8_ = 0x3f3180003f318000;
                auVar96._12_4_ = 0x3f318000;
                auVar96._16_4_ = 0x3f318000;
                auVar96._20_4_ = 0x3f318000;
                auVar96._24_4_ = 0x3f318000;
                auVar96._28_4_ = 0x3f318000;
                auVar241 = vfmsub231ps_fma(auVar137,auVar147,auVar96);
                auVar264._8_4_ = 0x395e8083;
                auVar264._0_8_ = 0x395e8083395e8083;
                auVar264._12_4_ = 0x395e8083;
                auVar264._16_4_ = 0x395e8083;
                auVar264._20_4_ = 0x395e8083;
                auVar264._24_4_ = 0x395e8083;
                auVar264._28_4_ = 0x395e8083;
                auVar402 = vfmsub231ps_fma(ZEXT1632(auVar241),auVar147,auVar264);
                auVar137 = ZEXT1632(auVar402);
                auVar18._28_4_ = auVar150._28_4_;
                auVar18._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar97._8_4_ = 0x3ab743ce;
                auVar97._0_8_ = 0x3ab743ce3ab743ce;
                auVar97._12_4_ = 0x3ab743ce;
                auVar97._16_4_ = 0x3ab743ce;
                auVar97._20_4_ = 0x3ab743ce;
                auVar97._24_4_ = 0x3ab743ce;
                auVar97._28_4_ = 0x3ab743ce;
                auVar241 = vfmadd213ps_fma(auVar143,auVar137,auVar97);
                auVar265._8_4_ = 0x3c088908;
                auVar265._0_8_ = 0x3c0889083c088908;
                auVar265._12_4_ = 0x3c088908;
                auVar265._16_4_ = 0x3c088908;
                auVar265._20_4_ = 0x3c088908;
                auVar265._24_4_ = 0x3c088908;
                auVar265._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar265);
                auVar266._8_4_ = 0x3d2aa9c1;
                auVar266._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar266._12_4_ = 0x3d2aa9c1;
                auVar266._16_4_ = 0x3d2aa9c1;
                auVar266._20_4_ = 0x3d2aa9c1;
                auVar266._24_4_ = 0x3d2aa9c1;
                auVar266._28_4_ = 0x3d2aa9c1;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar266);
                auVar267._8_4_ = 0x3e2aaaaa;
                auVar267._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar267._12_4_ = 0x3e2aaaaa;
                auVar267._16_4_ = 0x3e2aaaaa;
                auVar267._20_4_ = 0x3e2aaaaa;
                auVar267._24_4_ = 0x3e2aaaaa;
                auVar267._28_4_ = 0x3e2aaaaa;
                auVar143 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar143,auVar267);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar143,auVar323);
                auVar335 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar18,auVar143);
                auVar106._0_4_ = (int)auVar147._0_4_;
                auVar106._4_4_ = (int)auVar147._4_4_;
                auVar106._8_4_ = (int)auVar147._8_4_;
                auVar106._12_4_ = (int)auVar147._12_4_;
                auVar144._16_4_ = (int)auVar147._16_4_;
                auVar144._0_16_ = auVar106;
                auVar144._20_4_ = (int)auVar147._20_4_;
                auVar144._24_4_ = (int)auVar147._24_4_;
                auVar144._28_4_ = (int)auVar147._28_4_;
                auVar402 = vpslld_avx(auVar106,0x17);
                auVar241 = vpslld_avx(auVar144._16_16_,0x17);
                auVar242._8_4_ = 0x3f800000;
                auVar242._0_8_ = 0x3f8000003f800000;
                auVar242._12_4_ = 0x3f800000;
                auVar241 = vpaddd_avx(auVar241,auVar242);
                auVar402 = vpaddd_avx(auVar402,auVar242);
                auVar145._16_16_ = auVar241;
                auVar145._0_16_ = auVar402;
                auVar227._0_4_ = auVar335._0_4_ + fVar57;
                auVar227._4_4_ = auVar335._4_4_ + fVar56;
                auVar227._8_4_ = auVar335._8_4_ + fVar480;
                auVar227._12_4_ = auVar335._12_4_ + fVar2;
                auVar227._16_4_ = fVar240 + 0.0;
                auVar227._20_4_ = fVar478 + 0.0;
                auVar227._24_4_ = fVar479 + 0.0;
                auVar227._28_4_ = fVar10 + 0.0;
                auVar241 = vfmadd213ps_fma(auVar145,auVar227,auVar141);
                auVar147 = vrcpps_avx(ZEXT1632(auVar241));
                auVar241 = vfmsub213ps_fma(ZEXT1632(auVar241),auVar147,auVar141);
                auVar241 = vfnmadd132ps_fma(ZEXT1632(auVar241),auVar147,auVar147);
                auVar147 = ZEXT1632(auVar241);
                break;
              case 5:
                auVar432._8_4_ = 0x42b0c0a5;
                auVar432._0_8_ = 0x42b0c0a542b0c0a5;
                auVar432._12_4_ = 0x42b0c0a5;
                auVar432._16_4_ = 0x42b0c0a5;
                auVar432._20_4_ = 0x42b0c0a5;
                auVar432._24_4_ = 0x42b0c0a5;
                auVar432._28_4_ = 0x42b0c0a5;
                auVar147 = vminps_avx(auVar432,auVar147);
                auVar220 = vmaxps_avx(auVar137,auVar147);
                auVar241 = vfmadd213ps_fma(auVar150,auVar220,auVar323);
                auVar230 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar147 = vcmpps_avx(ZEXT1632(auVar241),auVar230,1);
                auVar147 = vandps_avx(auVar147,auVar141);
                auVar147 = vsubps_avx(auVar230,auVar147);
                auVar329._8_4_ = 0x3f318000;
                auVar329._0_8_ = 0x3f3180003f318000;
                auVar329._12_4_ = 0x3f318000;
                auVar329._16_4_ = 0x3f318000;
                auVar329._20_4_ = 0x3f318000;
                auVar329._24_4_ = 0x3f318000;
                auVar329._28_4_ = 0x3f318000;
                auVar241 = vfmsub231ps_fma(auVar220,auVar147,auVar329);
                auVar87._8_4_ = 0xb95e8083;
                auVar87._0_8_ = 0xb95e8083b95e8083;
                auVar87._12_4_ = 0xb95e8083;
                auVar87._16_4_ = 0xb95e8083;
                auVar87._20_4_ = 0xb95e8083;
                auVar87._24_4_ = 0xb95e8083;
                auVar87._28_4_ = 0xb95e8083;
                auVar402 = vfnmsub231ps_fma(ZEXT1632(auVar241),auVar147,auVar87);
                auVar220 = ZEXT1632(auVar402);
                auVar15._28_4_ = auVar230._28_4_;
                auVar15._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar400._8_4_ = 0x3ab743ce;
                auVar400._0_8_ = 0x3ab743ce3ab743ce;
                auVar400._12_4_ = 0x3ab743ce;
                auVar400._16_4_ = 0x3ab743ce;
                auVar400._20_4_ = 0x3ab743ce;
                auVar400._24_4_ = 0x3ab743ce;
                auVar400._28_4_ = 0x3ab743ce;
                auVar241 = vfmadd213ps_fma(auVar143,auVar220,auVar400);
                auVar359._8_4_ = 0x3c088908;
                auVar359._0_8_ = 0x3c0889083c088908;
                auVar359._12_4_ = 0x3c088908;
                auVar359._16_4_ = 0x3c088908;
                auVar359._20_4_ = 0x3c088908;
                auVar359._24_4_ = 0x3c088908;
                auVar359._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar220,auVar359);
                auVar306._8_4_ = 0x3d2aa9c1;
                auVar306._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar306._12_4_ = 0x3d2aa9c1;
                auVar306._16_4_ = 0x3d2aa9c1;
                auVar306._20_4_ = 0x3d2aa9c1;
                auVar306._24_4_ = 0x3d2aa9c1;
                auVar306._28_4_ = 0x3d2aa9c1;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar220,auVar306);
                auVar88._8_4_ = 0x3e2aaaaa;
                auVar88._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar88._12_4_ = 0x3e2aaaaa;
                auVar88._16_4_ = 0x3e2aaaaa;
                auVar88._20_4_ = 0x3e2aaaaa;
                auVar88._24_4_ = 0x3e2aaaaa;
                auVar88._28_4_ = 0x3e2aaaaa;
                auVar220 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar220,auVar88);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar220,auVar323);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar15,auVar220);
                auVar221._0_4_ = auVar241._0_4_ + fVar57;
                auVar221._4_4_ = auVar241._4_4_ + fVar56;
                auVar221._8_4_ = auVar241._8_4_ + fVar480;
                auVar221._12_4_ = auVar241._12_4_ + fVar2;
                auVar221._16_4_ = fVar240 + 0.0;
                auVar221._20_4_ = fVar478 + 0.0;
                auVar221._24_4_ = fVar479 + 0.0;
                auVar221._28_4_ = fVar10 + 0.0;
                auVar335._0_4_ = (int)auVar147._0_4_;
                auVar335._4_4_ = (int)auVar147._4_4_;
                auVar335._8_4_ = (int)auVar147._8_4_;
                auVar335._12_4_ = (int)auVar147._12_4_;
                auVar260._16_4_ = (int)auVar147._16_4_;
                auVar260._0_16_ = auVar335;
                auVar260._20_4_ = (int)auVar147._20_4_;
                auVar260._24_4_ = (int)auVar147._24_4_;
                auVar260._28_4_ = (int)auVar147._28_4_;
                auVar402 = vpslld_avx(auVar335,0x17);
                auVar241 = vpslld_avx(auVar260._16_16_,0x17);
                auVar332._8_4_ = 0x3f800000;
                auVar332._0_8_ = 0x3f8000003f800000;
                auVar332._12_4_ = 0x3f800000;
                auVar241 = vpaddd_avx(auVar332,auVar241);
                auVar402 = vpaddd_avx(auVar402,auVar332);
                auVar471._16_16_ = auVar241;
                auVar471._0_16_ = auVar402;
                auVar335 = vfmadd213ps_fma(auVar471,auVar221,auVar141);
                auVar89._8_4_ = 0x800000;
                auVar89._0_8_ = 0x80000000800000;
                auVar89._12_4_ = 0x800000;
                auVar89._16_4_ = 0x800000;
                auVar89._20_4_ = 0x800000;
                auVar89._24_4_ = 0x800000;
                auVar89._28_4_ = 0x800000;
                auVar147 = vmaxps_avx(ZEXT1632(auVar335),auVar89);
                auVar402 = vpsrld_avx(auVar147._0_16_,0x17);
                auVar241 = vpsrld_avx(auVar147._16_16_,0x17);
                auVar90._8_4_ = 0x807fffff;
                auVar90._0_8_ = 0x807fffff807fffff;
                auVar90._12_4_ = 0x807fffff;
                auVar90._16_4_ = 0x807fffff;
                auVar90._20_4_ = 0x807fffff;
                auVar90._24_4_ = 0x807fffff;
                auVar90._28_4_ = 0x807fffff;
                auVar147 = vandps_avx(auVar147,auVar90);
                auVar230 = vorps_avx(auVar147,auVar323);
                auVar91._8_4_ = 0x3f3504f3;
                auVar91._0_8_ = 0x3f3504f33f3504f3;
                auVar91._12_4_ = 0x3f3504f3;
                auVar91._16_4_ = 0x3f3504f3;
                auVar91._20_4_ = 0x3f3504f3;
                auVar91._24_4_ = 0x3f3504f3;
                auVar91._28_4_ = 0x3f3504f3;
                auVar220 = vcmpps_avx(auVar91,auVar230,2);
                auVar147 = vandnps_avx(auVar220,auVar230);
                auVar222._0_4_ = auVar147._0_4_ + auVar230._0_4_ + -1.0;
                auVar222._4_4_ = auVar147._4_4_ + auVar230._4_4_ + -1.0;
                auVar222._8_4_ = auVar147._8_4_ + auVar230._8_4_ + -1.0;
                auVar222._12_4_ = auVar147._12_4_ + auVar230._12_4_ + -1.0;
                auVar222._16_4_ = auVar147._16_4_ + auVar230._16_4_ + -1.0;
                auVar222._20_4_ = auVar147._20_4_ + auVar230._20_4_ + -1.0;
                auVar222._24_4_ = auVar147._24_4_ + auVar230._24_4_ + -1.0;
                auVar222._28_4_ = auVar147._28_4_ + auVar230._28_4_ + -1.0;
                auVar241 = vpsubd_avx(auVar241,auVar220._16_16_);
                auVar422._8_4_ = 0xffffff81;
                auVar422._0_8_ = 0xffffff81ffffff81;
                auVar422._12_4_ = 0xffffff81;
                auVar241 = vpaddd_avx(auVar241,auVar422);
                auVar402 = vpsubd_avx(auVar402,auVar220._0_16_);
                auVar402 = vpaddd_avx(auVar422,auVar402);
                auVar261._16_16_ = auVar241;
                auVar261._0_16_ = auVar402;
                auVar16._4_4_ = auVar222._4_4_ * auVar222._4_4_;
                auVar16._0_4_ = auVar222._0_4_ * auVar222._0_4_;
                auVar16._8_4_ = auVar222._8_4_ * auVar222._8_4_;
                auVar16._12_4_ = auVar222._12_4_ * auVar222._12_4_;
                auVar16._16_4_ = auVar222._16_4_ * auVar222._16_4_;
                auVar16._20_4_ = auVar222._20_4_ * auVar222._20_4_;
                auVar16._24_4_ = auVar222._24_4_ * auVar222._24_4_;
                auVar16._28_4_ = auVar220._28_4_;
                auVar418._8_4_ = 0x3d9021bb;
                auVar418._0_8_ = 0x3d9021bb3d9021bb;
                auVar418._12_4_ = 0x3d9021bb;
                auVar418._16_4_ = 0x3d9021bb;
                auVar418._20_4_ = 0x3d9021bb;
                auVar418._24_4_ = 0x3d9021bb;
                auVar418._28_4_ = 0x3d9021bb;
                auVar360._8_4_ = 0xbdebd1b8;
                auVar360._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar360._12_4_ = 0xbdebd1b8;
                auVar360._16_4_ = 0xbdebd1b8;
                auVar360._20_4_ = 0xbdebd1b8;
                auVar360._24_4_ = 0xbdebd1b8;
                auVar360._28_4_ = 0xbdebd1b8;
                auVar241 = vfmadd213ps_fma(auVar418,auVar222,auVar360);
                auVar361._8_4_ = 0x3def251a;
                auVar361._0_8_ = 0x3def251a3def251a;
                auVar361._12_4_ = 0x3def251a;
                auVar361._16_4_ = 0x3def251a;
                auVar361._20_4_ = 0x3def251a;
                auVar361._24_4_ = 0x3def251a;
                auVar361._28_4_ = 0x3def251a;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar222,auVar361);
                auVar362._8_4_ = 0xbdfe5d4f;
                auVar362._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar362._12_4_ = 0xbdfe5d4f;
                auVar362._16_4_ = 0xbdfe5d4f;
                auVar362._20_4_ = 0xbdfe5d4f;
                auVar362._24_4_ = 0xbdfe5d4f;
                auVar362._28_4_ = 0xbdfe5d4f;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar222,auVar362);
                auVar363._8_4_ = 0x3e11e9bf;
                auVar363._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar363._12_4_ = 0x3e11e9bf;
                auVar363._16_4_ = 0x3e11e9bf;
                auVar363._20_4_ = 0x3e11e9bf;
                auVar363._24_4_ = 0x3e11e9bf;
                auVar363._28_4_ = 0x3e11e9bf;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar222,auVar363);
                auVar364._8_4_ = 0xbe2aae50;
                auVar364._0_8_ = 0xbe2aae50be2aae50;
                auVar364._12_4_ = 0xbe2aae50;
                auVar364._16_4_ = 0xbe2aae50;
                auVar364._20_4_ = 0xbe2aae50;
                auVar364._24_4_ = 0xbe2aae50;
                auVar364._28_4_ = 0xbe2aae50;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar222,auVar364);
                auVar365._8_4_ = 0x3e4cceac;
                auVar365._0_8_ = 0x3e4cceac3e4cceac;
                auVar365._12_4_ = 0x3e4cceac;
                auVar365._16_4_ = 0x3e4cceac;
                auVar365._20_4_ = 0x3e4cceac;
                auVar365._24_4_ = 0x3e4cceac;
                auVar365._28_4_ = 0x3e4cceac;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar222,auVar365);
                auVar366._8_4_ = 0xbe7ffffc;
                auVar366._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar366._12_4_ = 0xbe7ffffc;
                auVar366._16_4_ = 0xbe7ffffc;
                auVar366._20_4_ = 0xbe7ffffc;
                auVar366._24_4_ = 0xbe7ffffc;
                auVar366._28_4_ = 0xbe7ffffc;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar222,auVar366);
                auVar367._8_4_ = 0x3eaaaaaa;
                auVar367._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar367._12_4_ = 0x3eaaaaaa;
                auVar367._16_4_ = 0x3eaaaaaa;
                auVar367._20_4_ = 0x3eaaaaaa;
                auVar367._24_4_ = 0x3eaaaaaa;
                auVar367._28_4_ = 0x3eaaaaaa;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar222,auVar367);
                auVar419._0_4_ = auVar222._0_4_ * auVar222._0_4_ * auVar222._0_4_ * auVar241._0_4_;
                auVar419._4_4_ = auVar222._4_4_ * auVar222._4_4_ * auVar222._4_4_ * auVar241._4_4_;
                auVar419._8_4_ = auVar222._8_4_ * auVar222._8_4_ * auVar222._8_4_ * auVar241._8_4_;
                auVar419._12_4_ =
                     auVar222._12_4_ * auVar222._12_4_ * auVar222._12_4_ * auVar241._12_4_;
                auVar419._16_4_ = auVar222._16_4_ * auVar222._16_4_ * auVar222._16_4_ * 0.0;
                auVar419._20_4_ = auVar222._20_4_ * auVar222._20_4_ * auVar222._20_4_ * 0.0;
                auVar419._24_4_ = auVar222._24_4_ * auVar222._24_4_ * auVar222._24_4_ * 0.0;
                auVar419._28_4_ = 0;
                auVar220 = vcvtdq2ps_avx(auVar261);
                auVar433._8_4_ = 0xb95e8083;
                auVar433._0_8_ = 0xb95e8083b95e8083;
                auVar433._12_4_ = 0xb95e8083;
                auVar433._16_4_ = 0xb95e8083;
                auVar433._20_4_ = 0xb95e8083;
                auVar433._24_4_ = 0xb95e8083;
                auVar433._28_4_ = 0xb95e8083;
                auVar241 = vfmadd231ps_fma(auVar419,auVar220,auVar433);
                auVar241 = vfmsub231ps_fma(ZEXT1632(auVar241),auVar323,auVar16);
                auVar147 = vcmpps_avx(ZEXT1632(auVar335),ZEXT832(0) << 0x20,2);
                auVar230 = vsubps_avx(ZEXT1632(auVar241),auVar222);
                auVar241 = vfmsub231ps_fma(auVar230,auVar329,auVar220);
                auVar368._8_4_ = 0xc0000000;
                auVar368._0_8_ = 0xc0000000c0000000;
                auVar368._12_4_ = 0xc0000000;
                auVar368._16_4_ = 0xc0000000;
                auVar368._20_4_ = 0xc0000000;
                auVar368._24_4_ = 0xc0000000;
                auVar368._28_4_ = 0xc0000000;
                auVar223._0_4_ = auVar241._0_4_ * -2.0;
                auVar223._4_4_ = auVar241._4_4_ * -2.0;
                auVar223._8_4_ = auVar241._8_4_ * -2.0;
                auVar223._12_4_ = auVar241._12_4_ * -2.0;
                auVar223._16_4_ = 0x80000000;
                auVar223._20_4_ = 0x80000000;
                auVar223._24_4_ = 0x80000000;
                auVar223._28_4_ = 0;
                auVar262._8_4_ = 0x7fffffff;
                auVar262._0_8_ = 0x7fffffff7fffffff;
                auVar262._12_4_ = 0x7fffffff;
                auVar262._16_4_ = 0x7fffffff;
                auVar262._20_4_ = 0x7fffffff;
                auVar262._24_4_ = 0x7fffffff;
                auVar262._28_4_ = 0x7fffffff;
                auVar147 = vblendvps_avx(auVar223,auVar262,auVar147);
                auVar147 = vminps_avx(auVar432,auVar147);
                auVar379 = ZEXT3264(auVar137);
                auVar137 = vmaxps_avx(auVar137,auVar147);
                auVar476 = ZEXT3264(auVar150);
                auVar241 = vfmadd213ps_fma(auVar150,auVar137,auVar323);
                auVar150 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar147 = vcmpps_avx(ZEXT1632(auVar241),auVar150,1);
                auVar147 = vandps_avx(auVar147,auVar141);
                auVar147 = vsubps_avx(auVar150,auVar147);
                auVar241 = vfmsub231ps_fma(auVar137,auVar147,auVar329);
                auVar402 = vfnmsub231ps_fma(ZEXT1632(auVar241),auVar147,auVar433);
                auVar137 = ZEXT1632(auVar402);
                auVar17._28_4_ = auVar150._28_4_;
                auVar17._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar331 = ZEXT3264(auVar143);
                auVar241 = vfmadd213ps_fma(auVar143,auVar137,auVar400);
                auVar472._8_4_ = 0x3c088908;
                auVar472._0_8_ = 0x3c0889083c088908;
                auVar472._12_4_ = 0x3c088908;
                auVar472._16_4_ = 0x3c088908;
                auVar472._20_4_ = 0x3c088908;
                auVar472._24_4_ = 0x3c088908;
                auVar472._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar472);
                auVar92._8_4_ = 0x3d2aa9c1;
                auVar92._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar92._12_4_ = 0x3d2aa9c1;
                auVar92._16_4_ = 0x3d2aa9c1;
                auVar92._20_4_ = 0x3d2aa9c1;
                auVar92._24_4_ = 0x3d2aa9c1;
                auVar92._28_4_ = 0x3d2aa9c1;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar92);
                auVar93._8_4_ = 0x3e2aaaaa;
                auVar93._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar93._12_4_ = 0x3e2aaaaa;
                auVar93._16_4_ = 0x3e2aaaaa;
                auVar93._20_4_ = 0x3e2aaaaa;
                auVar93._24_4_ = 0x3e2aaaaa;
                auVar93._28_4_ = 0x3e2aaaaa;
                auVar143 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar143,auVar93);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar143,auVar323);
                auVar335 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar17,auVar143);
                auVar324 = ZEXT3264(auVar141);
                auVar157._0_4_ = (int)auVar147._0_4_;
                auVar157._4_4_ = (int)auVar147._4_4_;
                auVar157._8_4_ = (int)auVar147._8_4_;
                auVar157._12_4_ = (int)auVar147._12_4_;
                auVar224._16_4_ = (int)auVar147._16_4_;
                auVar224._0_16_ = auVar157;
                auVar224._20_4_ = (int)auVar147._20_4_;
                auVar224._24_4_ = (int)auVar147._24_4_;
                auVar224._28_4_ = (int)auVar147._28_4_;
                auVar402 = vpslld_avx(auVar157,0x17);
                auVar241 = vpslld_avx(auVar224._16_16_,0x17);
                auVar278._8_4_ = 0x3f800000;
                auVar278._0_8_ = 0x3f8000003f800000;
                auVar278._12_4_ = 0x3f800000;
                auVar241 = vpaddd_avx(auVar241,auVar278);
                auVar402 = vpaddd_avx(auVar402,auVar278);
                auVar225._16_16_ = auVar241;
                auVar225._0_16_ = auVar402;
                auVar263._0_4_ = auVar335._0_4_ + fVar57;
                auVar263._4_4_ = auVar335._4_4_ + fVar56;
                auVar263._8_4_ = auVar335._8_4_ + fVar480;
                auVar263._12_4_ = auVar335._12_4_ + fVar2;
                auVar263._16_4_ = fVar240 + 0.0;
                auVar263._20_4_ = fVar478 + 0.0;
                auVar263._24_4_ = fVar479 + 0.0;
                auVar263._28_4_ = fVar10 + 0.0;
                auVar241 = vfmadd213ps_fma(auVar225,auVar263,auVar141);
                auVar147 = vrcpps_avx(ZEXT1632(auVar241));
                auVar241 = vfmsub213ps_fma(ZEXT1632(auVar241),auVar147,auVar141);
                auVar241 = vfnmadd132ps_fma(ZEXT1632(auVar241),auVar147,auVar147);
                auVar94._8_4_ = 0xbf800000;
                auVar94._0_8_ = 0xbf800000bf800000;
                auVar94._12_4_ = 0xbf800000;
                auVar94._16_4_ = 0xbf800000;
                auVar94._20_4_ = 0xbf800000;
                auVar94._24_4_ = 0xbf800000;
                auVar94._28_4_ = 0xbf800000;
                auVar241 = vfnmadd213ps_fma(ZEXT1632(auVar241),auVar368,auVar94);
                auVar206 = ZEXT1628(auVar241);
                goto LAB_0052d881;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar228._4_4_ = uVar1;
                auVar228._0_4_ = uVar1;
                auVar228._8_4_ = uVar1;
                auVar228._12_4_ = uVar1;
                auVar228._16_4_ = uVar1;
                auVar228._20_4_ = uVar1;
                auVar228._24_4_ = uVar1;
                auVar228._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar268._4_4_ = uVar1;
                auVar268._0_4_ = uVar1;
                auVar268._8_4_ = uVar1;
                auVar268._12_4_ = uVar1;
                auVar268._16_4_ = uVar1;
                auVar268._20_4_ = uVar1;
                auVar268._24_4_ = uVar1;
                auVar268._28_4_ = uVar1;
                auVar241 = vfmadd231ps_fma(auVar268,auVar147,auVar228);
                auVar147 = vmaxps_avx(ZEXT1632(auVar241),_DAT_005537a0);
                auVar147 = vminps_avx(auVar147,auVar141);
                auVar206 = auVar147._0_28_;
LAB_0052d881:
                auVar477._0_4_ = auVar206._0_4_ * auVar154._0_4_;
                auVar477._4_4_ = auVar206._4_4_ * auVar154._4_4_;
                auVar477._8_4_ = auVar206._8_4_ * auVar154._8_4_;
                auVar477._12_4_ = auVar206._12_4_ * auVar154._12_4_;
                auVar477._16_4_ = auVar206._16_4_ * auVar154._16_4_;
                auVar477._20_4_ = auVar206._20_4_ * auVar154._20_4_;
                auVar477._24_4_ = auVar206._24_4_ * auVar154._24_4_;
                auVar147 = auVar477._0_32_;
              }
              *pauVar45 = auVar147;
              pauVar45 = pauVar45 + 1;
              bVar55 = iVar37 != iVar4;
              iVar37 = iVar37 + 1;
            } while (bVar55);
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != _h);
      }
      if ((local_c8 == 0 && uVar3 == 4) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        local_100 = 0;
        auVar476 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar324 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar154 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar331 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar379 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        do {
          if (-1 < iVar4) {
            pauVar45 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_100 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86_fma;
            iVar50 = 0;
            iVar37 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar477 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar477 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var5) +
                                     local_100 * 0x20));
              }
              if (iVar26 < 1) {
                auVar155 = ZEXT3264(auVar477._0_32_);
              }
              else {
                pauVar52 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * local_100 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                puVar38 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar50) * 4 + 4);
                uVar46 = 0;
                do {
                  if (*(int *)(&this->field_0xd4 + (long)p_Var5) < 1) {
                    auVar155 = ZEXT3264(auVar477._0_32_);
                  }
                  else {
                    puVar31 = puVar38;
                    iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      uVar1 = puVar31[-3];
                      auVar148._4_4_ = uVar1;
                      auVar148._0_4_ = uVar1;
                      auVar148._8_4_ = uVar1;
                      auVar148._12_4_ = uVar1;
                      auVar148._16_4_ = uVar1;
                      auVar148._20_4_ = uVar1;
                      auVar148._24_4_ = uVar1;
                      auVar148._28_4_ = uVar1;
                      uVar1 = puVar31[-2];
                      auVar229._4_4_ = uVar1;
                      auVar229._0_4_ = uVar1;
                      auVar229._8_4_ = uVar1;
                      auVar229._12_4_ = uVar1;
                      auVar229._16_4_ = uVar1;
                      auVar229._20_4_ = uVar1;
                      auVar229._24_4_ = uVar1;
                      auVar229._28_4_ = uVar1;
                      uVar1 = puVar31[-1];
                      auVar269._4_4_ = uVar1;
                      auVar269._0_4_ = uVar1;
                      auVar269._8_4_ = uVar1;
                      auVar269._12_4_ = uVar1;
                      auVar269._16_4_ = uVar1;
                      auVar269._20_4_ = uVar1;
                      auVar269._24_4_ = uVar1;
                      auVar269._28_4_ = uVar1;
                      uVar1 = *puVar31;
                      auVar318._4_4_ = uVar1;
                      auVar318._0_4_ = uVar1;
                      auVar318._8_4_ = uVar1;
                      auVar318._12_4_ = uVar1;
                      auVar318._16_4_ = uVar1;
                      auVar318._20_4_ = uVar1;
                      auVar318._24_4_ = uVar1;
                      auVar318._28_4_ = uVar1;
                      auVar241 = vfmadd132ps_fma(auVar148,auVar477._0_32_,*pauVar52);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar229,pauVar52[1]);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar269,pauVar52[2]);
                      auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar318,pauVar52[3]);
                      auVar155 = ZEXT1664(auVar241);
                      pauVar52 = pauVar52 + 4;
                      puVar31 = puVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 2);
                      auVar477 = ZEXT1664(auVar241);
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar46 = uVar46 + 1;
                  puVar38 = (undefined4 *)
                            ((long)puVar38 +
                            (long)local_a8.w *
                            CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                  auVar477 = ZEXT3264(auVar155._0_32_);
                } while (uVar46 != uVar51);
              }
              auVar147 = auVar155._0_32_;
              p_Var5 = pp_Var6[-3];
              auVar143 = auVar331._0_32_;
              auVar137 = auVar379._0_32_;
              auVar141 = auVar324._0_32_;
              auVar150 = auVar476._0_32_;
              auVar220 = auVar154._0_32_;
              auVar156._28_36_ = auVar155._28_36_;
              fVar57 = auVar331._0_4_;
              fVar56 = auVar331._4_4_;
              fVar480 = auVar331._8_4_;
              fVar2 = auVar331._12_4_;
              fVar240 = auVar331._16_4_;
              fVar478 = auVar331._20_4_;
              fVar479 = auVar331._24_4_;
              fVar10 = auVar331._28_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar147 = vmaxps_avx(auVar147,_DAT_005537a0);
                break;
              case 2:
                auVar141 = vmaxps_avx(auVar147,ZEXT1632(ZEXT816(0) << 0x40));
                auVar147 = vminps_avx(auVar147,ZEXT1632(ZEXT816(0) << 0x40));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar153._4_4_ = uVar1;
                auVar153._0_4_ = uVar1;
                auVar153._8_4_ = uVar1;
                auVar153._12_4_ = uVar1;
                auVar153._16_4_ = uVar1;
                auVar153._20_4_ = uVar1;
                auVar153._24_4_ = uVar1;
                auVar153._28_4_ = uVar1;
                auVar241 = vfmadd213ps_fma(auVar153,auVar147,auVar141);
                auVar147 = ZEXT1632(auVar241);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar237._4_4_ = uVar1;
                auVar237._0_4_ = uVar1;
                auVar237._8_4_ = uVar1;
                auVar237._12_4_ = uVar1;
                auVar237._16_4_ = uVar1;
                auVar237._20_4_ = uVar1;
                auVar237._24_4_ = uVar1;
                auVar237._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar475._4_4_ = uVar1;
                auVar475._0_4_ = uVar1;
                auVar475._8_4_ = uVar1;
                auVar475._12_4_ = uVar1;
                auVar475._16_4_ = uVar1;
                auVar475._20_4_ = uVar1;
                auVar475._24_4_ = uVar1;
                auVar475._28_4_ = uVar1;
                auVar147 = vmaxps_avx(auVar147,auVar237);
                auVar147 = vminps_avx(auVar475,auVar147);
                break;
              case 4:
                auVar149._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
                auVar149._8_4_ = -auVar155._8_4_;
                auVar149._12_4_ = -auVar155._12_4_;
                auVar149._16_4_ = -auVar155._16_4_;
                auVar149._20_4_ = -auVar155._20_4_;
                auVar149._24_4_ = -auVar155._24_4_;
                auVar149._28_4_ = auVar155._28_4_ ^ 0x80000000;
                auVar101._8_4_ = 0x42b0c0a5;
                auVar101._0_8_ = 0x42b0c0a542b0c0a5;
                auVar101._12_4_ = 0x42b0c0a5;
                auVar101._16_4_ = 0x42b0c0a5;
                auVar101._20_4_ = 0x42b0c0a5;
                auVar101._24_4_ = 0x42b0c0a5;
                auVar101._28_4_ = 0x42b0c0a5;
                auVar147 = vminps_avx(auVar149,auVar101);
                auVar150 = vmaxps_avx(auVar150,auVar147);
                auVar241 = vfmadd213ps_fma(auVar220,auVar150,auVar141);
                auVar220 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar147 = vcmpps_avx(ZEXT1632(auVar241),auVar220,1);
                auVar147 = vandps_avx(auVar147,auVar143);
                auVar147 = vsubps_avx(auVar220,auVar147);
                auVar102._8_4_ = 0x3f318000;
                auVar102._0_8_ = 0x3f3180003f318000;
                auVar102._12_4_ = 0x3f318000;
                auVar102._16_4_ = 0x3f318000;
                auVar102._20_4_ = 0x3f318000;
                auVar102._24_4_ = 0x3f318000;
                auVar102._28_4_ = 0x3f318000;
                auVar241 = vfmsub231ps_fma(auVar150,auVar147,auVar102);
                auVar274._8_4_ = 0x395e8083;
                auVar274._0_8_ = 0x395e8083395e8083;
                auVar274._12_4_ = 0x395e8083;
                auVar274._16_4_ = 0x395e8083;
                auVar274._20_4_ = 0x395e8083;
                auVar274._24_4_ = 0x395e8083;
                auVar274._28_4_ = 0x395e8083;
                auVar402 = vfmsub231ps_fma(ZEXT1632(auVar241),auVar147,auVar274);
                auVar150 = ZEXT1632(auVar402);
                auVar22._28_4_ = auVar220._28_4_;
                auVar22._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar103._8_4_ = 0x3ab743ce;
                auVar103._0_8_ = 0x3ab743ce3ab743ce;
                auVar103._12_4_ = 0x3ab743ce;
                auVar103._16_4_ = 0x3ab743ce;
                auVar103._20_4_ = 0x3ab743ce;
                auVar103._24_4_ = 0x3ab743ce;
                auVar103._28_4_ = 0x3ab743ce;
                auVar241 = vfmadd213ps_fma(auVar137,auVar150,auVar103);
                auVar275._8_4_ = 0x3c088908;
                auVar275._0_8_ = 0x3c0889083c088908;
                auVar275._12_4_ = 0x3c088908;
                auVar275._16_4_ = 0x3c088908;
                auVar275._20_4_ = 0x3c088908;
                auVar275._24_4_ = 0x3c088908;
                auVar275._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar150,auVar275);
                auVar276._8_4_ = 0x3d2aa9c1;
                auVar276._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar276._12_4_ = 0x3d2aa9c1;
                auVar276._16_4_ = 0x3d2aa9c1;
                auVar276._20_4_ = 0x3d2aa9c1;
                auVar276._24_4_ = 0x3d2aa9c1;
                auVar276._28_4_ = 0x3d2aa9c1;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar150,auVar276);
                auVar104._8_4_ = 0x3e2aaaaa;
                auVar104._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar104._12_4_ = 0x3e2aaaaa;
                auVar104._16_4_ = 0x3e2aaaaa;
                auVar104._20_4_ = 0x3e2aaaaa;
                auVar104._24_4_ = 0x3e2aaaaa;
                auVar104._28_4_ = 0x3e2aaaaa;
                auVar137 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar104);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar141);
                auVar335 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar22,auVar137);
                auVar107._0_4_ = (int)auVar147._0_4_;
                auVar107._4_4_ = (int)auVar147._4_4_;
                auVar107._8_4_ = (int)auVar147._8_4_;
                auVar107._12_4_ = (int)auVar147._12_4_;
                auVar151._16_4_ = (int)auVar147._16_4_;
                auVar151._0_16_ = auVar107;
                auVar151._20_4_ = (int)auVar147._20_4_;
                auVar151._24_4_ = (int)auVar147._24_4_;
                auVar151._28_4_ = (int)auVar147._28_4_;
                auVar402 = vpslld_avx(auVar107,0x17);
                auVar241 = vpslld_avx(auVar151._16_16_,0x17);
                auVar60._8_4_ = 0x3f800000;
                auVar60._0_8_ = 0x3f8000003f800000;
                auVar60._12_4_ = 0x3f800000;
                auVar241 = vpaddd_avx(auVar241,auVar60);
                auVar402 = vpaddd_avx(auVar402,auVar60);
                auVar152._16_16_ = auVar241;
                auVar152._0_16_ = auVar402;
                auVar238._0_4_ = auVar335._0_4_ + fVar57;
                auVar238._4_4_ = auVar335._4_4_ + fVar56;
                auVar238._8_4_ = auVar335._8_4_ + fVar480;
                auVar238._12_4_ = auVar335._12_4_ + fVar2;
                auVar238._16_4_ = fVar240 + 0.0;
                auVar238._20_4_ = fVar478 + 0.0;
                auVar238._24_4_ = fVar479 + 0.0;
                auVar238._28_4_ = fVar10 + 0.0;
                auVar241 = vfmadd213ps_fma(auVar152,auVar238,auVar143);
                auVar147 = vrcpps_avx(ZEXT1632(auVar241));
                auVar241 = vfmsub213ps_fma(ZEXT1632(auVar241),auVar147,auVar143);
                auVar241 = vfnmadd132ps_fma(ZEXT1632(auVar241),auVar147,auVar147);
                auVar147 = ZEXT1632(auVar241);
                break;
              case 5:
                auVar434._8_4_ = 0x42b0c0a5;
                auVar434._0_8_ = 0x42b0c0a542b0c0a5;
                auVar434._12_4_ = 0x42b0c0a5;
                auVar434._16_4_ = 0x42b0c0a5;
                auVar434._20_4_ = 0x42b0c0a5;
                auVar434._24_4_ = 0x42b0c0a5;
                auVar434._28_4_ = 0x42b0c0a5;
                auVar147 = vminps_avx(auVar434,auVar147);
                auVar230 = vmaxps_avx(auVar150,auVar147);
                auVar241 = vfmadd213ps_fma(auVar220,auVar230,auVar141);
                auVar441 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar147 = vcmpps_avx(ZEXT1632(auVar241),auVar441,1);
                auVar147 = vandps_avx(auVar147,auVar143);
                auVar147 = vsubps_avx(auVar441,auVar147);
                auVar330._8_4_ = 0x3f318000;
                auVar330._0_8_ = 0x3f3180003f318000;
                auVar330._12_4_ = 0x3f318000;
                auVar330._16_4_ = 0x3f318000;
                auVar330._20_4_ = 0x3f318000;
                auVar330._24_4_ = 0x3f318000;
                auVar330._28_4_ = 0x3f318000;
                auVar241 = vfmsub231ps_fma(auVar230,auVar147,auVar330);
                auVar98._8_4_ = 0xb95e8083;
                auVar98._0_8_ = 0xb95e8083b95e8083;
                auVar98._12_4_ = 0xb95e8083;
                auVar98._16_4_ = 0xb95e8083;
                auVar98._20_4_ = 0xb95e8083;
                auVar98._24_4_ = 0xb95e8083;
                auVar98._28_4_ = 0xb95e8083;
                auVar402 = vfnmsub231ps_fma(ZEXT1632(auVar241),auVar147,auVar98);
                auVar230 = ZEXT1632(auVar402);
                auVar19._28_4_ = auVar441._28_4_;
                auVar19._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar401._8_4_ = 0x3ab743ce;
                auVar401._0_8_ = 0x3ab743ce3ab743ce;
                auVar401._12_4_ = 0x3ab743ce;
                auVar401._16_4_ = 0x3ab743ce;
                auVar401._20_4_ = 0x3ab743ce;
                auVar401._24_4_ = 0x3ab743ce;
                auVar401._28_4_ = 0x3ab743ce;
                auVar241 = vfmadd213ps_fma(auVar137,auVar230,auVar401);
                auVar369._8_4_ = 0x3c088908;
                auVar369._0_8_ = 0x3c0889083c088908;
                auVar369._12_4_ = 0x3c088908;
                auVar369._16_4_ = 0x3c088908;
                auVar369._20_4_ = 0x3c088908;
                auVar369._24_4_ = 0x3c088908;
                auVar369._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar230,auVar369);
                auVar307._8_4_ = 0x3d2aa9c1;
                auVar307._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar307._12_4_ = 0x3d2aa9c1;
                auVar307._16_4_ = 0x3d2aa9c1;
                auVar307._20_4_ = 0x3d2aa9c1;
                auVar307._24_4_ = 0x3d2aa9c1;
                auVar307._28_4_ = 0x3d2aa9c1;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar230,auVar307);
                auVar308._8_4_ = 0x3e2aaaaa;
                auVar308._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar308._12_4_ = 0x3e2aaaaa;
                auVar308._16_4_ = 0x3e2aaaaa;
                auVar308._20_4_ = 0x3e2aaaaa;
                auVar308._24_4_ = 0x3e2aaaaa;
                auVar308._28_4_ = 0x3e2aaaaa;
                auVar230 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar230,auVar308);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar230,auVar141);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar19,auVar230);
                auVar231._0_4_ = auVar241._0_4_ + fVar57;
                auVar231._4_4_ = auVar241._4_4_ + fVar56;
                auVar231._8_4_ = auVar241._8_4_ + fVar480;
                auVar231._12_4_ = auVar241._12_4_ + fVar2;
                auVar231._16_4_ = fVar240 + 0.0;
                auVar231._20_4_ = fVar478 + 0.0;
                auVar231._24_4_ = fVar479 + 0.0;
                auVar231._28_4_ = fVar10 + 0.0;
                auVar243._0_4_ = (int)auVar147._0_4_;
                auVar243._4_4_ = (int)auVar147._4_4_;
                auVar243._8_4_ = (int)auVar147._8_4_;
                auVar243._12_4_ = (int)auVar147._12_4_;
                auVar270._16_4_ = (int)auVar147._16_4_;
                auVar270._0_16_ = auVar243;
                auVar270._20_4_ = (int)auVar147._20_4_;
                auVar270._24_4_ = (int)auVar147._24_4_;
                auVar270._28_4_ = (int)auVar147._28_4_;
                auVar402 = vpslld_avx(auVar243,0x17);
                auVar241 = vpslld_avx(auVar270._16_16_,0x17);
                auVar333._8_4_ = 0x3f800000;
                auVar333._0_8_ = 0x3f8000003f800000;
                auVar333._12_4_ = 0x3f800000;
                auVar241 = vpaddd_avx(auVar333,auVar241);
                auVar402 = vpaddd_avx(auVar402,auVar333);
                auVar474._16_16_ = auVar241;
                auVar474._0_16_ = auVar402;
                auVar335 = vfmadd213ps_fma(auVar474,auVar231,auVar143);
                auVar232._8_4_ = 0x800000;
                auVar232._0_8_ = 0x80000000800000;
                auVar232._12_4_ = 0x800000;
                auVar232._16_4_ = 0x800000;
                auVar232._20_4_ = 0x800000;
                auVar232._24_4_ = 0x800000;
                auVar232._28_4_ = 0x800000;
                auVar147 = vmaxps_avx(ZEXT1632(auVar335),auVar232);
                auVar402 = vpsrld_avx(auVar147._0_16_,0x17);
                auVar241 = vpsrld_avx(auVar147._16_16_,0x17);
                auVar309._8_4_ = 0x807fffff;
                auVar309._0_8_ = 0x807fffff807fffff;
                auVar309._12_4_ = 0x807fffff;
                auVar309._16_4_ = 0x807fffff;
                auVar309._20_4_ = 0x807fffff;
                auVar309._24_4_ = 0x807fffff;
                auVar309._28_4_ = 0x807fffff;
                auVar147 = vandps_avx(auVar147,auVar309);
                auVar441 = vorps_avx(auVar147,auVar141);
                auVar310._8_4_ = 0x3f3504f3;
                auVar310._0_8_ = 0x3f3504f33f3504f3;
                auVar310._12_4_ = 0x3f3504f3;
                auVar310._16_4_ = 0x3f3504f3;
                auVar310._20_4_ = 0x3f3504f3;
                auVar310._24_4_ = 0x3f3504f3;
                auVar310._28_4_ = 0x3f3504f3;
                auVar230 = vcmpps_avx(auVar310,auVar441,2);
                auVar147 = vandnps_avx(auVar230,auVar441);
                auVar233._0_4_ = auVar147._0_4_ + auVar441._0_4_ + -1.0;
                auVar233._4_4_ = auVar147._4_4_ + auVar441._4_4_ + -1.0;
                auVar233._8_4_ = auVar147._8_4_ + auVar441._8_4_ + -1.0;
                auVar233._12_4_ = auVar147._12_4_ + auVar441._12_4_ + -1.0;
                auVar233._16_4_ = auVar147._16_4_ + auVar441._16_4_ + -1.0;
                auVar233._20_4_ = auVar147._20_4_ + auVar441._20_4_ + -1.0;
                auVar233._24_4_ = auVar147._24_4_ + auVar441._24_4_ + -1.0;
                auVar233._28_4_ = auVar147._28_4_ + auVar441._28_4_ + -1.0;
                auVar241 = vpsubd_avx(auVar241,auVar230._16_16_);
                auVar423._8_4_ = 0xffffff81;
                auVar423._0_8_ = 0xffffff81ffffff81;
                auVar423._12_4_ = 0xffffff81;
                auVar241 = vpaddd_avx(auVar241,auVar423);
                auVar402 = vpsubd_avx(auVar402,auVar230._0_16_);
                auVar402 = vpaddd_avx(auVar423,auVar402);
                auVar271._16_16_ = auVar241;
                auVar271._0_16_ = auVar402;
                auVar20._4_4_ = auVar233._4_4_ * auVar233._4_4_;
                auVar20._0_4_ = auVar233._0_4_ * auVar233._0_4_;
                auVar20._8_4_ = auVar233._8_4_ * auVar233._8_4_;
                auVar20._12_4_ = auVar233._12_4_ * auVar233._12_4_;
                auVar20._16_4_ = auVar233._16_4_ * auVar233._16_4_;
                auVar20._20_4_ = auVar233._20_4_ * auVar233._20_4_;
                auVar20._24_4_ = auVar233._24_4_ * auVar233._24_4_;
                auVar20._28_4_ = auVar230._28_4_;
                auVar420._8_4_ = 0x3d9021bb;
                auVar420._0_8_ = 0x3d9021bb3d9021bb;
                auVar420._12_4_ = 0x3d9021bb;
                auVar420._16_4_ = 0x3d9021bb;
                auVar420._20_4_ = 0x3d9021bb;
                auVar420._24_4_ = 0x3d9021bb;
                auVar420._28_4_ = 0x3d9021bb;
                auVar370._8_4_ = 0xbdebd1b8;
                auVar370._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar370._12_4_ = 0xbdebd1b8;
                auVar370._16_4_ = 0xbdebd1b8;
                auVar370._20_4_ = 0xbdebd1b8;
                auVar370._24_4_ = 0xbdebd1b8;
                auVar370._28_4_ = 0xbdebd1b8;
                auVar241 = vfmadd213ps_fma(auVar420,auVar233,auVar370);
                auVar371._8_4_ = 0x3def251a;
                auVar371._0_8_ = 0x3def251a3def251a;
                auVar371._12_4_ = 0x3def251a;
                auVar371._16_4_ = 0x3def251a;
                auVar371._20_4_ = 0x3def251a;
                auVar371._24_4_ = 0x3def251a;
                auVar371._28_4_ = 0x3def251a;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar233,auVar371);
                auVar372._8_4_ = 0xbdfe5d4f;
                auVar372._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar372._12_4_ = 0xbdfe5d4f;
                auVar372._16_4_ = 0xbdfe5d4f;
                auVar372._20_4_ = 0xbdfe5d4f;
                auVar372._24_4_ = 0xbdfe5d4f;
                auVar372._28_4_ = 0xbdfe5d4f;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar233,auVar372);
                auVar373._8_4_ = 0x3e11e9bf;
                auVar373._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar373._12_4_ = 0x3e11e9bf;
                auVar373._16_4_ = 0x3e11e9bf;
                auVar373._20_4_ = 0x3e11e9bf;
                auVar373._24_4_ = 0x3e11e9bf;
                auVar373._28_4_ = 0x3e11e9bf;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar233,auVar373);
                auVar374._8_4_ = 0xbe2aae50;
                auVar374._0_8_ = 0xbe2aae50be2aae50;
                auVar374._12_4_ = 0xbe2aae50;
                auVar374._16_4_ = 0xbe2aae50;
                auVar374._20_4_ = 0xbe2aae50;
                auVar374._24_4_ = 0xbe2aae50;
                auVar374._28_4_ = 0xbe2aae50;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar233,auVar374);
                auVar375._8_4_ = 0x3e4cceac;
                auVar375._0_8_ = 0x3e4cceac3e4cceac;
                auVar375._12_4_ = 0x3e4cceac;
                auVar375._16_4_ = 0x3e4cceac;
                auVar375._20_4_ = 0x3e4cceac;
                auVar375._24_4_ = 0x3e4cceac;
                auVar375._28_4_ = 0x3e4cceac;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar233,auVar375);
                auVar376._8_4_ = 0xbe7ffffc;
                auVar376._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar376._12_4_ = 0xbe7ffffc;
                auVar376._16_4_ = 0xbe7ffffc;
                auVar376._20_4_ = 0xbe7ffffc;
                auVar376._24_4_ = 0xbe7ffffc;
                auVar376._28_4_ = 0xbe7ffffc;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar233,auVar376);
                auVar377._8_4_ = 0x3eaaaaaa;
                auVar377._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar377._12_4_ = 0x3eaaaaaa;
                auVar377._16_4_ = 0x3eaaaaaa;
                auVar377._20_4_ = 0x3eaaaaaa;
                auVar377._24_4_ = 0x3eaaaaaa;
                auVar377._28_4_ = 0x3eaaaaaa;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar233,auVar377);
                auVar421._0_4_ = auVar233._0_4_ * auVar233._0_4_ * auVar233._0_4_ * auVar241._0_4_;
                auVar421._4_4_ = auVar233._4_4_ * auVar233._4_4_ * auVar233._4_4_ * auVar241._4_4_;
                auVar421._8_4_ = auVar233._8_4_ * auVar233._8_4_ * auVar233._8_4_ * auVar241._8_4_;
                auVar421._12_4_ =
                     auVar233._12_4_ * auVar233._12_4_ * auVar233._12_4_ * auVar241._12_4_;
                auVar421._16_4_ = auVar233._16_4_ * auVar233._16_4_ * auVar233._16_4_ * 0.0;
                auVar421._20_4_ = auVar233._20_4_ * auVar233._20_4_ * auVar233._20_4_ * 0.0;
                auVar421._24_4_ = auVar233._24_4_ * auVar233._24_4_ * auVar233._24_4_ * 0.0;
                auVar421._28_4_ = 0;
                auVar230 = vcvtdq2ps_avx(auVar271);
                auVar435._8_4_ = 0xb95e8083;
                auVar435._0_8_ = 0xb95e8083b95e8083;
                auVar435._12_4_ = 0xb95e8083;
                auVar435._16_4_ = 0xb95e8083;
                auVar435._20_4_ = 0xb95e8083;
                auVar435._24_4_ = 0xb95e8083;
                auVar435._28_4_ = 0xb95e8083;
                auVar241 = vfmadd231ps_fma(auVar421,auVar230,auVar435);
                auVar241 = vfmsub231ps_fma(ZEXT1632(auVar241),auVar141,auVar20);
                auVar147 = vcmpps_avx(ZEXT1632(auVar335),ZEXT832(0) << 0x20,2);
                auVar441 = vsubps_avx(ZEXT1632(auVar241),auVar233);
                auVar241 = vfmsub231ps_fma(auVar441,auVar330,auVar230);
                auVar378._8_4_ = 0xc0000000;
                auVar378._0_8_ = 0xc0000000c0000000;
                auVar378._12_4_ = 0xc0000000;
                auVar378._16_4_ = 0xc0000000;
                auVar378._20_4_ = 0xc0000000;
                auVar378._24_4_ = 0xc0000000;
                auVar378._28_4_ = 0xc0000000;
                auVar234._0_4_ = auVar241._0_4_ * -2.0;
                auVar234._4_4_ = auVar241._4_4_ * -2.0;
                auVar234._8_4_ = auVar241._8_4_ * -2.0;
                auVar234._12_4_ = auVar241._12_4_ * -2.0;
                auVar234._16_4_ = 0x80000000;
                auVar234._20_4_ = 0x80000000;
                auVar234._24_4_ = 0x80000000;
                auVar234._28_4_ = 0;
                auVar272._8_4_ = 0x7fffffff;
                auVar272._0_8_ = 0x7fffffff7fffffff;
                auVar272._12_4_ = 0x7fffffff;
                auVar272._16_4_ = 0x7fffffff;
                auVar272._20_4_ = 0x7fffffff;
                auVar272._24_4_ = 0x7fffffff;
                auVar272._28_4_ = 0x7fffffff;
                auVar147 = vblendvps_avx(auVar234,auVar272,auVar147);
                auVar147 = vminps_avx(auVar434,auVar147);
                auVar476 = ZEXT3264(auVar150);
                auVar150 = vmaxps_avx(auVar150,auVar147);
                auVar154 = ZEXT3264(auVar220);
                auVar241 = vfmadd213ps_fma(auVar220,auVar150,auVar141);
                auVar220 = vroundps_avx(ZEXT1632(auVar241),1);
                auVar147 = vcmpps_avx(ZEXT1632(auVar241),auVar220,1);
                auVar147 = vandps_avx(auVar147,auVar143);
                auVar147 = vsubps_avx(auVar220,auVar147);
                auVar241 = vfmsub231ps_fma(auVar150,auVar147,auVar330);
                auVar402 = vfnmsub231ps_fma(ZEXT1632(auVar241),auVar147,auVar435);
                auVar150 = ZEXT1632(auVar402);
                auVar21._28_4_ = auVar220._28_4_;
                auVar21._0_28_ =
                     ZEXT1628(CONCAT412(auVar402._12_4_ * auVar402._12_4_,
                                        CONCAT48(auVar402._8_4_ * auVar402._8_4_,
                                                 CONCAT44(auVar402._4_4_ * auVar402._4_4_,
                                                          auVar402._0_4_ * auVar402._0_4_))));
                auVar379 = ZEXT3264(auVar137);
                auVar241 = vfmadd213ps_fma(auVar137,auVar150,auVar401);
                auVar311._8_4_ = 0x3c088908;
                auVar311._0_8_ = 0x3c0889083c088908;
                auVar311._12_4_ = 0x3c088908;
                auVar311._16_4_ = 0x3c088908;
                auVar311._20_4_ = 0x3c088908;
                auVar311._24_4_ = 0x3c088908;
                auVar311._28_4_ = 0x3c088908;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar150,auVar311);
                auVar312._8_4_ = 0x3d2aa9c1;
                auVar312._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar312._12_4_ = 0x3d2aa9c1;
                auVar312._16_4_ = 0x3d2aa9c1;
                auVar312._20_4_ = 0x3d2aa9c1;
                auVar312._24_4_ = 0x3d2aa9c1;
                auVar312._28_4_ = 0x3d2aa9c1;
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar150,auVar312);
                auVar324 = ZEXT3264(auVar141);
                auVar331 = ZEXT3264(auVar143);
                auVar99._8_4_ = 0x3e2aaaaa;
                auVar99._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar99._12_4_ = 0x3e2aaaaa;
                auVar99._16_4_ = 0x3e2aaaaa;
                auVar99._20_4_ = 0x3e2aaaaa;
                auVar99._24_4_ = 0x3e2aaaaa;
                auVar99._28_4_ = 0x3e2aaaaa;
                auVar137 = ZEXT1632(auVar402);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar99);
                auVar241 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar137,auVar141);
                auVar335 = vfmadd213ps_fma(ZEXT1632(auVar241),auVar21,auVar137);
                auVar158._0_4_ = (int)auVar147._0_4_;
                auVar158._4_4_ = (int)auVar147._4_4_;
                auVar158._8_4_ = (int)auVar147._8_4_;
                auVar158._12_4_ = (int)auVar147._12_4_;
                auVar235._16_4_ = (int)auVar147._16_4_;
                auVar235._0_16_ = auVar158;
                auVar235._20_4_ = (int)auVar147._20_4_;
                auVar235._24_4_ = (int)auVar147._24_4_;
                auVar235._28_4_ = (int)auVar147._28_4_;
                auVar402 = vpslld_avx(auVar158,0x17);
                auVar241 = vpslld_avx(auVar235._16_16_,0x17);
                auVar59._8_4_ = 0x3f800000;
                auVar59._0_8_ = 0x3f8000003f800000;
                auVar59._12_4_ = 0x3f800000;
                auVar241 = vpaddd_avx(auVar241,auVar59);
                auVar402 = vpaddd_avx(auVar402,auVar59);
                auVar236._16_16_ = auVar241;
                auVar236._0_16_ = auVar402;
                auVar273._0_4_ = auVar335._0_4_ + fVar57;
                auVar273._4_4_ = auVar335._4_4_ + fVar56;
                auVar273._8_4_ = auVar335._8_4_ + fVar480;
                auVar273._12_4_ = auVar335._12_4_ + fVar2;
                auVar273._16_4_ = fVar240 + 0.0;
                auVar273._20_4_ = fVar478 + 0.0;
                auVar273._24_4_ = fVar479 + 0.0;
                auVar273._28_4_ = fVar10 + 0.0;
                auVar241 = vfmadd213ps_fma(auVar236,auVar273,auVar143);
                auVar147 = vrcpps_avx(ZEXT1632(auVar241));
                auVar241 = vfmsub213ps_fma(ZEXT1632(auVar241),auVar147,auVar143);
                auVar241 = vfnmadd132ps_fma(ZEXT1632(auVar241),auVar147,auVar147);
                auVar100._8_4_ = 0xbf800000;
                auVar100._0_8_ = 0xbf800000bf800000;
                auVar100._12_4_ = 0xbf800000;
                auVar100._16_4_ = 0xbf800000;
                auVar100._20_4_ = 0xbf800000;
                auVar100._24_4_ = 0xbf800000;
                auVar100._28_4_ = 0xbf800000;
                auVar241 = vfnmadd213ps_fma(ZEXT1632(auVar241),auVar378,auVar100);
                auVar206 = ZEXT1628(auVar241);
                goto LAB_0052dec9;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar239._4_4_ = uVar1;
                auVar239._0_4_ = uVar1;
                auVar239._8_4_ = uVar1;
                auVar239._12_4_ = uVar1;
                auVar239._16_4_ = uVar1;
                auVar239._20_4_ = uVar1;
                auVar239._24_4_ = uVar1;
                auVar239._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar277._4_4_ = uVar1;
                auVar277._0_4_ = uVar1;
                auVar277._8_4_ = uVar1;
                auVar277._12_4_ = uVar1;
                auVar277._16_4_ = uVar1;
                auVar277._20_4_ = uVar1;
                auVar277._24_4_ = uVar1;
                auVar277._28_4_ = uVar1;
                auVar241 = vfmadd231ps_fma(auVar277,auVar147,auVar239);
                auVar147 = vmaxps_avx(ZEXT1632(auVar241),_DAT_005537a0);
                auVar147 = vminps_avx(auVar147,auVar143);
                auVar206 = auVar147._0_28_;
LAB_0052dec9:
                auVar156._0_4_ = auVar206._0_4_ * auVar155._0_4_;
                auVar156._4_4_ = auVar206._4_4_ * auVar155._4_4_;
                auVar156._8_4_ = auVar206._8_4_ * auVar155._8_4_;
                auVar156._12_4_ = auVar206._12_4_ * auVar155._12_4_;
                auVar156._16_4_ = auVar206._16_4_ * auVar155._16_4_;
                auVar156._20_4_ = auVar206._20_4_ * auVar155._20_4_;
                auVar156._24_4_ = auVar206._24_4_ * auVar155._24_4_;
                auVar147 = auVar156._0_32_;
              }
              *pauVar45 = auVar147;
              pauVar45 = pauVar45 + 1;
              iVar50 = iVar50 + 4;
              bVar55 = iVar37 != iVar4;
              iVar37 = iVar37 + 1;
            } while (bVar55);
          }
          local_100 = local_100 + 1;
        } while (local_100 != _h);
      }
      uVar30 = uVar33 ^ 1;
      if ((uVar30 == 0 && uVar32 == 0) && 0 < (int)_h) {
        local_48 = (long)top_blob->w * top_blob->elemsize;
        local_50 = top_blob->data;
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        local_58 = (this->weight_data_packed).data;
        local_60 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_40 = (ulong)_h;
        uVar46 = 0;
        do {
          pvVar25 = local_50;
          pvVar9 = local_a8.data;
          if (-1 < iVar4) {
            lVar28 = local_48 * uVar46;
            pauVar45 = (undefined1 (*) [32])(local_60 * uVar46 + (long)local_58);
            lVar54 = (long)local_a8.w;
            lVar44 = CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize);
            pp_Var7 = this->_vptr_Convolution1D_x86_fma;
            iVar37 = 0;
            uVar34 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                fVar57 = 0.0;
              }
              else {
                fVar57 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar46 * 4);
              }
              if (iVar26 < 1) {
                auVar147 = SUB6432(ZEXT864(0),0);
              }
              else {
                p_Var5 = pp_Var7[-3];
                pauVar52 = (undefined1 (*) [32])
                           ((long)(_func_int ***)pvVar9 +
                           (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar37) * 4);
                auVar324 = ZEXT864(0);
                uVar39 = 0;
                pauVar41 = pauVar45;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    pauVar47 = pauVar52;
                    iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      auVar241 = vfmadd231ps_fma(auVar324._0_32_,*pauVar41,*pauVar47);
                      auVar324 = ZEXT1664(auVar241);
                      pauVar41 = pauVar41 + 1;
                      pauVar47 = (undefined1 (*) [32])
                                 (*pauVar47 +
                                 (long)(*(int *)(&this->field_0xd8 + (long)p_Var5) << 3) * 4);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  auVar147 = auVar324._0_32_;
                  uVar39 = uVar39 + 1;
                  pauVar52 = (undefined1 (*) [32])(*pauVar52 + lVar54 * lVar44);
                } while (uVar39 != uVar51);
              }
              auVar108._0_4_ = auVar147._16_4_ + auVar147._0_4_;
              auVar108._4_4_ = auVar147._20_4_ + auVar147._4_4_;
              auVar108._8_4_ = auVar147._24_4_ + auVar147._8_4_;
              auVar108._12_4_ = auVar147._28_4_ + auVar147._12_4_;
              auVar241 = vshufpd_avx(auVar108,auVar108,1);
              auVar109._0_4_ = auVar241._0_4_ + auVar108._0_4_;
              auVar109._4_4_ = auVar241._4_4_ + auVar108._4_4_;
              auVar109._8_4_ = auVar241._8_4_ + auVar108._8_4_;
              auVar109._12_4_ = auVar241._12_4_ + auVar108._12_4_;
              auVar241 = vmovshdup_avx(auVar109);
              fVar57 = auVar241._0_4_ + fVar57 + auVar109._0_4_;
              p_Var5 = pp_Var6[-3];
              auVar241 = ZEXT416((uint)fVar57);
              fVar56 = fVar57;
              if (*(int *)(&this->field_0xf4 + (long)p_Var5) - 1U < 6) {
                switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
                case 1:
                  auVar241 = vmaxss_avx(ZEXT416((uint)fVar57),ZEXT416(0));
                  fVar56 = auVar241._0_4_;
                  break;
                case 2:
                  auVar61._0_12_ = ZEXT812(0);
                  auVar61._12_4_ = 0;
                  auVar241 = vcmpss_avx(auVar61,ZEXT416((uint)fVar57),1);
                  auVar160._8_4_ = 0x3f800000;
                  auVar160._0_8_ = 0x3f8000003f800000;
                  auVar160._12_4_ = 0x3f800000;
                  auVar241 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var5)),
                                           auVar160,auVar241);
                  fVar56 = auVar241._0_4_ * fVar57;
                  break;
                case 3:
                  fVar57 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar241 = vmaxss_avx(auVar241,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                    (long)p_Var5)));
                  fVar56 = auVar241._0_4_;
                  if (fVar57 < auVar241._0_4_) {
                    fVar56 = fVar57;
                  }
                  break;
                case 4:
                  auVar241 = vminss_avx(auVar241,ZEXT416(0x42b0c0a5));
                  auVar110._0_8_ = auVar241._0_8_ ^ 0x8000000080000000;
                  auVar110._8_4_ = auVar241._8_4_ ^ 0x80000000;
                  auVar110._12_4_ = auVar241._12_4_ ^ 0x80000000;
                  auVar241 = vcmpss_avx(auVar241,ZEXT416(0xc2b0c0a5),1);
                  auVar159._8_4_ = 0x42b0c0a5;
                  auVar159._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar159._12_4_ = 0x42b0c0a5;
                  auVar241 = vblendvps_avx(auVar110,auVar159,auVar241);
                  fVar57 = expf(auVar241._0_4_);
                  fVar56 = 1.0 / (fVar57 + 1.0);
                  break;
                case 5:
                  fVar56 = expf(fVar57);
                  fVar56 = logf(fVar56 + 1.0);
                  fVar56 = tanhf(fVar56);
                  fVar56 = fVar56 * fVar57;
                  break;
                case 6:
                  fVar480 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                  fVar2 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                  fVar240 = -fVar2 / fVar480;
                  fVar56 = 0.0;
                  if ((fVar240 <= fVar57) && (fVar56 = fVar57, fVar57 <= fVar240 + 1.0 / fVar480)) {
                    auVar241 = vfmadd213ss_fma(ZEXT416((uint)fVar480),auVar241,ZEXT416((uint)fVar2))
                    ;
                    fVar56 = auVar241._0_4_ * fVar57;
                  }
                }
              }
              *(float *)((long)pvVar25 + uVar34 * 4 + lVar28) = fVar56;
              uVar34 = uVar34 + 1;
              iVar37 = iVar37 + 8;
            } while (uVar34 != local_38);
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != local_40);
      }
      uVar33 = uVar33 ^ 4;
      if ((uVar32 == 0 && uVar33 == 0) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        local_100 = 0;
        auVar331 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar313._8_4_ = 0x3f000000;
        auVar313._0_8_ = 0x3f0000003f000000;
        auVar313._12_4_ = 0x3f000000;
        auVar324 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar450._8_4_ = 0x3ab743ce;
        auVar450._0_8_ = 0x3ab743ce3ab743ce;
        auVar450._12_4_ = 0x3ab743ce;
        do {
          if (-1 < iVar4) {
            pauVar42 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_100 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86_fma;
            iVar50 = 0;
            iVar37 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar111 = ZEXT816(0) << 0x40;
              }
              else {
                auVar111 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var5) + local_100 * 0x10);
              }
              if (0 < iVar26) {
                pauVar53 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * local_100 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                puVar38 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_a8.data + 0x18))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar50) * 4 + 4);
                uVar46 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    puVar31 = puVar38;
                    iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      uVar1 = puVar31[-7];
                      auVar455._4_4_ = uVar1;
                      auVar455._0_4_ = uVar1;
                      auVar455._8_4_ = uVar1;
                      auVar455._12_4_ = uVar1;
                      uVar1 = puVar31[-6];
                      auVar161._4_4_ = uVar1;
                      auVar161._0_4_ = uVar1;
                      auVar161._8_4_ = uVar1;
                      auVar161._12_4_ = uVar1;
                      uVar1 = puVar31[-5];
                      auVar279._4_4_ = uVar1;
                      auVar279._0_4_ = uVar1;
                      auVar279._8_4_ = uVar1;
                      auVar279._12_4_ = uVar1;
                      uVar1 = puVar31[-4];
                      auVar334._4_4_ = uVar1;
                      auVar334._0_4_ = uVar1;
                      auVar334._8_4_ = uVar1;
                      auVar334._12_4_ = uVar1;
                      uVar1 = puVar31[-3];
                      auVar380._4_4_ = uVar1;
                      auVar380._0_4_ = uVar1;
                      auVar380._8_4_ = uVar1;
                      auVar380._12_4_ = uVar1;
                      uVar1 = puVar31[-2];
                      auVar403._4_4_ = uVar1;
                      auVar403._0_4_ = uVar1;
                      auVar403._8_4_ = uVar1;
                      auVar403._12_4_ = uVar1;
                      uVar1 = puVar31[-1];
                      auVar424._4_4_ = uVar1;
                      auVar424._0_4_ = uVar1;
                      auVar424._8_4_ = uVar1;
                      auVar424._12_4_ = uVar1;
                      uVar1 = *puVar31;
                      auVar436._4_4_ = uVar1;
                      auVar436._0_4_ = uVar1;
                      auVar436._8_4_ = uVar1;
                      auVar436._12_4_ = uVar1;
                      auVar241 = vfmadd132ps_fma(auVar455,auVar111,*pauVar53);
                      auVar241 = vfmadd231ps_fma(auVar241,auVar161,pauVar53[1]);
                      auVar241 = vfmadd231ps_fma(auVar241,auVar279,pauVar53[2]);
                      auVar241 = vfmadd231ps_fma(auVar241,auVar334,pauVar53[3]);
                      auVar241 = vfmadd231ps_fma(auVar241,auVar380,pauVar53[4]);
                      auVar241 = vfmadd231ps_fma(auVar241,auVar403,pauVar53[5]);
                      auVar241 = vfmadd231ps_fma(auVar241,auVar424,pauVar53[6]);
                      auVar111 = vfmadd231ps_fma(auVar241,auVar436,pauVar53[7]);
                      pauVar53 = pauVar53 + 8;
                      puVar31 = puVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 3);
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar46 = uVar46 + 1;
                  puVar38 = (undefined4 *)
                            ((long)puVar38 +
                            (long)local_a8.w *
                            CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar46 != uVar51);
              }
              p_Var5 = pp_Var6[-3];
              auVar402 = auVar331._0_16_;
              auVar241 = auVar324._0_16_;
              fVar57 = auVar324._0_4_;
              fVar56 = auVar324._4_4_;
              fVar480 = auVar324._8_4_;
              fVar2 = auVar324._12_4_;
              fVar240 = auVar111._4_4_;
              fVar478 = auVar111._8_4_;
              fVar479 = auVar111._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar111 = vmaxps_avx(auVar111,auVar402);
                break;
              case 2:
                auVar241 = vmaxps_avx(auVar111,auVar402);
                auVar402 = vminps_avx(auVar111,auVar402);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar458._4_4_ = uVar1;
                auVar458._0_4_ = uVar1;
                auVar458._8_4_ = uVar1;
                auVar458._12_4_ = uVar1;
                auVar111 = vfmadd213ps_fma(auVar458,auVar402,auVar241);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar114._4_4_ = uVar1;
                auVar114._0_4_ = uVar1;
                auVar114._8_4_ = uVar1;
                auVar114._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar337._4_4_ = uVar1;
                auVar337._0_4_ = uVar1;
                auVar337._8_4_ = uVar1;
                auVar337._12_4_ = uVar1;
                auVar241 = vmaxps_avx(auVar111,auVar114);
                auVar111 = vminps_avx(auVar337,auVar241);
                break;
              case 4:
                auVar115._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
                auVar115._8_4_ = -fVar478;
                auVar115._12_4_ = -fVar479;
                auVar168._8_4_ = 0x42b0c0a5;
                auVar168._0_8_ = 0x42b0c0a542b0c0a5;
                auVar168._12_4_ = 0x42b0c0a5;
                auVar402 = vminps_avx(auVar115,auVar168);
                auVar169._8_4_ = 0xc2b0c0a5;
                auVar169._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar169._12_4_ = 0xc2b0c0a5;
                auVar121 = vmaxps_avx(auVar402,auVar169);
                auVar338._8_4_ = 0x3fb8aa3b;
                auVar338._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar338._12_4_ = 0x3fb8aa3b;
                auVar402 = vfmadd213ps_fma(auVar338,auVar121,auVar313);
                auVar456._0_4_ = (int)auVar402._0_4_;
                auVar456._4_4_ = (int)auVar402._4_4_;
                auVar456._8_4_ = (int)auVar402._8_4_;
                auVar456._12_4_ = (int)auVar402._12_4_;
                auVar335 = vcvtdq2ps_avx(auVar456);
                auVar402 = vcmpps_avx(auVar402,auVar335,1);
                auVar402 = vandps_avx(auVar402,auVar241);
                auVar402 = vsubps_avx(auVar335,auVar402);
                auVar64._8_4_ = 0x3f318000;
                auVar64._0_8_ = 0x3f3180003f318000;
                auVar64._12_4_ = 0x3f318000;
                auVar335 = vfmsub231ps_fma(auVar121,auVar402,auVar64);
                auVar170._8_4_ = 0x395e8083;
                auVar170._0_8_ = 0x395e8083395e8083;
                auVar170._12_4_ = 0x395e8083;
                auVar121 = vfmsub231ps_fma(auVar335,auVar402,auVar170);
                auVar457._0_4_ = auVar121._0_4_ * auVar121._0_4_;
                auVar457._4_4_ = auVar121._4_4_ * auVar121._4_4_;
                auVar457._8_4_ = auVar121._8_4_ * auVar121._8_4_;
                auVar457._12_4_ = auVar121._12_4_ * auVar121._12_4_;
                auVar407._8_4_ = 0x39506967;
                auVar407._0_8_ = 0x3950696739506967;
                auVar407._12_4_ = 0x39506967;
                auVar171._8_4_ = 0x3ab743ce;
                auVar171._0_8_ = 0x3ab743ce3ab743ce;
                auVar171._12_4_ = 0x3ab743ce;
                auVar335 = vfmadd213ps_fma(auVar407,auVar121,auVar171);
                auVar172._8_4_ = 0x3c088908;
                auVar172._0_8_ = 0x3c0889083c088908;
                auVar172._12_4_ = 0x3c088908;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar172);
                auVar65._8_4_ = 0x3d2aa9c1;
                auVar65._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar65._12_4_ = 0x3d2aa9c1;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar65);
                auVar66._8_4_ = 0x3e2aaaaa;
                auVar66._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar66._12_4_ = 0x3e2aaaaa;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar66);
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar313);
                auVar335 = vfmadd213ps_fma(auVar335,auVar457,auVar121);
                auVar116._0_4_ = auVar335._0_4_ + fVar57;
                auVar116._4_4_ = auVar335._4_4_ + fVar56;
                auVar116._8_4_ = auVar335._8_4_ + fVar480;
                auVar116._12_4_ = auVar335._12_4_ + fVar2;
                auVar339._0_4_ = (int)auVar402._0_4_;
                auVar339._4_4_ = (int)auVar402._4_4_;
                auVar339._8_4_ = (int)auVar402._8_4_;
                auVar339._12_4_ = (int)auVar402._12_4_;
                auVar402 = vpslld_avx(auVar339,0x17);
                auVar402 = vpaddd_avx(auVar402,auVar241);
                auVar335 = vfmadd213ps_fma(auVar402,auVar116,auVar241);
                auVar402 = vrcpps_avx(auVar335);
                auVar241 = vfmsub213ps_fma(auVar335,auVar402,auVar241);
                auVar111 = vfnmadd132ps_fma(auVar241,auVar402,auVar402);
                break;
              case 5:
                auVar425._8_4_ = 0x42b0c0a5;
                auVar425._0_8_ = 0x42b0c0a542b0c0a5;
                auVar425._12_4_ = 0x42b0c0a5;
                auVar402 = vminps_avx(auVar111,auVar425);
                auVar437._8_4_ = 0xc2b0c0a5;
                auVar437._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar437._12_4_ = 0xc2b0c0a5;
                auVar121 = vmaxps_avx(auVar437,auVar402);
                auVar445._8_4_ = 0x3fb8aa3b;
                auVar445._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar445._12_4_ = 0x3fb8aa3b;
                auVar402 = vfmadd213ps_fma(auVar445,auVar121,auVar313);
                auVar404._0_4_ = (int)auVar402._0_4_;
                auVar404._4_4_ = (int)auVar402._4_4_;
                auVar404._8_4_ = (int)auVar402._8_4_;
                auVar404._12_4_ = (int)auVar402._12_4_;
                auVar335 = vcvtdq2ps_avx(auVar404);
                auVar402 = vcmpps_avx(auVar402,auVar335,1);
                auVar402 = vandps_avx(auVar402,auVar241);
                auVar402 = vsubps_avx(auVar335,auVar402);
                auVar426._8_4_ = 0x3f318000;
                auVar426._0_8_ = 0x3f3180003f318000;
                auVar426._12_4_ = 0x3f318000;
                auVar335 = vfmsub231ps_fma(auVar121,auVar402,auVar426);
                auVar319._8_4_ = 0xb95e8083;
                auVar319._0_8_ = 0xb95e8083b95e8083;
                auVar319._12_4_ = 0xb95e8083;
                auVar121 = vfnmsub231ps_fma(auVar335,auVar402,auVar319);
                auVar405._0_4_ = auVar121._0_4_ * auVar121._0_4_;
                auVar405._4_4_ = auVar121._4_4_ * auVar121._4_4_;
                auVar405._8_4_ = auVar121._8_4_ * auVar121._8_4_;
                auVar405._12_4_ = auVar121._12_4_ * auVar121._12_4_;
                auVar325._8_4_ = 0x39506967;
                auVar325._0_8_ = 0x3950696739506967;
                auVar325._12_4_ = 0x39506967;
                auVar335 = vfmadd213ps_fma(auVar325,auVar121,auVar450);
                auVar244._8_4_ = 0x3c088908;
                auVar244._0_8_ = 0x3c0889083c088908;
                auVar244._12_4_ = 0x3c088908;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar244);
                auVar245._8_4_ = 0x3d2aa9c1;
                auVar245._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar245._12_4_ = 0x3d2aa9c1;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar245);
                auVar280._8_4_ = 0x3e2aaaaa;
                auVar280._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar280._12_4_ = 0x3e2aaaaa;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar280);
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar313);
                auVar335 = vfmadd213ps_fma(auVar335,auVar405,auVar121);
                auVar162._0_4_ = auVar335._0_4_ + fVar57;
                auVar162._4_4_ = auVar335._4_4_ + fVar56;
                auVar162._8_4_ = auVar335._8_4_ + fVar480;
                auVar162._12_4_ = auVar335._12_4_ + fVar2;
                auVar112._0_4_ = (int)auVar402._0_4_;
                auVar112._4_4_ = (int)auVar402._4_4_;
                auVar112._8_4_ = (int)auVar402._8_4_;
                auVar112._12_4_ = (int)auVar402._12_4_;
                auVar402 = vpslld_avx(auVar112,0x17);
                auVar402 = vpaddd_avx(auVar402,auVar241);
                auVar58 = vfmadd213ps_fma(auVar402,auVar162,auVar241);
                auVar163._8_4_ = 0x800000;
                auVar163._0_8_ = 0x80000000800000;
                auVar163._12_4_ = 0x800000;
                auVar402 = vmaxps_avx(auVar58,auVar163);
                auVar335 = vpsrld_avx(auVar402,0x17);
                auVar281._8_4_ = 0xffffff82;
                auVar281._0_8_ = 0xffffff82ffffff82;
                auVar281._12_4_ = 0xffffff82;
                auVar335 = vpaddd_avx(auVar335,auVar281);
                auVar282._8_4_ = 0x807fffff;
                auVar282._0_8_ = 0x807fffff807fffff;
                auVar282._12_4_ = 0x807fffff;
                auVar402 = vandps_avx(auVar402,auVar282);
                auVar341 = vorps_avx(auVar402,auVar313);
                auVar121 = vcvtdq2ps_avx(auVar335);
                auVar283._8_4_ = 0x3f3504f3;
                auVar283._0_8_ = 0x3f3504f33f3504f3;
                auVar283._12_4_ = 0x3f3504f3;
                auVar335 = vcmpps_avx(auVar341,auVar283,1);
                auVar402 = vandps_avx(auVar335,auVar341);
                auVar164._0_4_ = auVar341._0_4_ + -1.0 + auVar402._0_4_;
                auVar164._4_4_ = auVar341._4_4_ + -1.0 + auVar402._4_4_;
                auVar164._8_4_ = auVar341._8_4_ + -1.0 + auVar402._8_4_;
                auVar164._12_4_ = auVar341._12_4_ + -1.0 + auVar402._12_4_;
                auVar402 = vandps_avx(auVar335,auVar241);
                auVar335 = vsubps_avx(auVar121,auVar402);
                auVar336._0_4_ = auVar164._0_4_ * auVar164._0_4_;
                auVar336._4_4_ = auVar164._4_4_ * auVar164._4_4_;
                auVar336._8_4_ = auVar164._8_4_ * auVar164._8_4_;
                auVar336._12_4_ = auVar164._12_4_ * auVar164._12_4_;
                auVar406._8_4_ = 0x3d9021bb;
                auVar406._0_8_ = 0x3d9021bb3d9021bb;
                auVar406._12_4_ = 0x3d9021bb;
                auVar381._8_4_ = 0xbdebd1b8;
                auVar381._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar381._12_4_ = 0xbdebd1b8;
                auVar402 = vfmadd213ps_fma(auVar406,auVar164,auVar381);
                auVar382._8_4_ = 0x3def251a;
                auVar382._0_8_ = 0x3def251a3def251a;
                auVar382._12_4_ = 0x3def251a;
                auVar402 = vfmadd213ps_fma(auVar402,auVar164,auVar382);
                auVar383._8_4_ = 0xbdfe5d4f;
                auVar383._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar383._12_4_ = 0xbdfe5d4f;
                auVar402 = vfmadd213ps_fma(auVar402,auVar164,auVar383);
                auVar384._8_4_ = 0x3e11e9bf;
                auVar384._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar384._12_4_ = 0x3e11e9bf;
                auVar402 = vfmadd213ps_fma(auVar402,auVar164,auVar384);
                auVar385._8_4_ = 0xbe2aae50;
                auVar385._0_8_ = 0xbe2aae50be2aae50;
                auVar385._12_4_ = 0xbe2aae50;
                auVar402 = vfmadd213ps_fma(auVar402,auVar164,auVar385);
                auVar386._8_4_ = 0x3e4cceac;
                auVar386._0_8_ = 0x3e4cceac3e4cceac;
                auVar386._12_4_ = 0x3e4cceac;
                auVar402 = vfmadd213ps_fma(auVar402,auVar164,auVar386);
                auVar387._8_4_ = 0xbe7ffffc;
                auVar387._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar387._12_4_ = 0xbe7ffffc;
                auVar402 = vfmadd213ps_fma(auVar402,auVar164,auVar387);
                auVar388._8_4_ = 0x3eaaaaaa;
                auVar388._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar388._12_4_ = 0x3eaaaaaa;
                auVar402 = vfmadd213ps_fma(auVar402,auVar164,auVar388);
                auVar389._0_4_ = auVar336._0_4_ * auVar164._0_4_ * auVar402._0_4_;
                auVar389._4_4_ = auVar336._4_4_ * auVar164._4_4_ * auVar402._4_4_;
                auVar389._8_4_ = auVar336._8_4_ * auVar164._8_4_ * auVar402._8_4_;
                auVar389._12_4_ = auVar336._12_4_ * auVar164._12_4_ * auVar402._12_4_;
                auVar402 = vfmadd231ps_fma(auVar389,auVar335,auVar319);
                auVar121 = vfmsub231ps_fma(auVar402,auVar313,auVar336);
                auVar402 = vcmpps_avx(auVar58,_DAT_0054e060,2);
                auVar121 = vsubps_avx(auVar121,auVar164);
                auVar335 = vfnmadd231ps_fma(auVar121,auVar426,auVar335);
                auVar165._0_4_ = auVar335._0_4_ + auVar335._0_4_;
                auVar165._4_4_ = auVar335._4_4_ + auVar335._4_4_;
                auVar165._8_4_ = auVar335._8_4_ + auVar335._8_4_;
                auVar165._12_4_ = auVar335._12_4_ + auVar335._12_4_;
                auVar284._8_4_ = 0x7fffffff;
                auVar284._0_8_ = 0x7fffffff7fffffff;
                auVar284._12_4_ = 0x7fffffff;
                auVar402 = vblendvps_avx(auVar165,auVar284,auVar402);
                auVar166._8_4_ = 0x42b0c0a5;
                auVar166._0_8_ = 0x42b0c0a542b0c0a5;
                auVar166._12_4_ = 0x42b0c0a5;
                auVar402 = vminps_avx(auVar402,auVar166);
                auVar121 = vmaxps_avx(auVar437,auVar402);
                auVar402 = vfmadd213ps_fma(auVar445,auVar121,auVar313);
                auVar285._0_4_ = (int)auVar402._0_4_;
                auVar285._4_4_ = (int)auVar402._4_4_;
                auVar285._8_4_ = (int)auVar402._8_4_;
                auVar285._12_4_ = (int)auVar402._12_4_;
                auVar335 = vcvtdq2ps_avx(auVar285);
                auVar402 = vcmpps_avx(auVar402,auVar335,1);
                auVar402 = vandps_avx(auVar402,auVar241);
                auVar402 = vsubps_avx(auVar335,auVar402);
                auVar335 = vfmsub231ps_fma(auVar121,auVar402,auVar426);
                auVar121 = vfnmsub231ps_fma(auVar335,auVar402,auVar319);
                auVar286._0_4_ = auVar121._0_4_ * auVar121._0_4_;
                auVar286._4_4_ = auVar121._4_4_ * auVar121._4_4_;
                auVar286._8_4_ = auVar121._8_4_ * auVar121._8_4_;
                auVar286._12_4_ = auVar121._12_4_ * auVar121._12_4_;
                auVar335 = vfmadd213ps_fma(auVar325,auVar121,auVar450);
                auVar320._8_4_ = 0x3c088908;
                auVar320._0_8_ = 0x3c0889083c088908;
                auVar320._12_4_ = 0x3c088908;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar320);
                auVar331 = ZEXT864(0) << 0x20;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar245);
                auVar324 = ZEXT1664(auVar241);
                auVar62._8_4_ = 0x3e2aaaaa;
                auVar62._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar62._12_4_ = 0x3e2aaaaa;
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar62);
                auVar335 = vfmadd213ps_fma(auVar335,auVar121,auVar313);
                auVar335 = vfmadd213ps_fma(auVar335,auVar286,auVar121);
                auVar113._0_4_ = auVar335._0_4_ + fVar57;
                auVar113._4_4_ = auVar335._4_4_ + fVar56;
                auVar113._8_4_ = auVar335._8_4_ + fVar480;
                auVar113._12_4_ = auVar335._12_4_ + fVar2;
                auVar167._0_4_ = (int)auVar402._0_4_;
                auVar167._4_4_ = (int)auVar402._4_4_;
                auVar167._8_4_ = (int)auVar402._8_4_;
                auVar167._12_4_ = (int)auVar402._12_4_;
                auVar402 = vpslld_avx(auVar167,0x17);
                auVar402 = vpaddd_avx(auVar402,auVar241);
                auVar402 = vfmadd213ps_fma(auVar402,auVar113,auVar241);
                auVar241 = vrcpps_avx(auVar402);
                auVar287._0_4_ = auVar241._0_4_ + auVar241._0_4_;
                auVar287._4_4_ = auVar241._4_4_ + auVar241._4_4_;
                auVar287._8_4_ = auVar241._8_4_ + auVar241._8_4_;
                auVar287._12_4_ = auVar241._12_4_ + auVar241._12_4_;
                auVar63._8_4_ = 0x40000000;
                auVar63._0_8_ = 0x4000000040000000;
                auVar63._12_4_ = 0x40000000;
                auVar402 = vfmsub213ps_fma(auVar402,auVar287,auVar63);
                auVar241 = vfnmadd213ps_fma(auVar402,auVar241,auVar287);
                auVar111 = vfmsub231ps_fma(auVar111,auVar111,auVar241);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar117._4_4_ = uVar1;
                auVar117._0_4_ = uVar1;
                auVar117._8_4_ = uVar1;
                auVar117._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar173._4_4_ = uVar1;
                auVar173._0_4_ = uVar1;
                auVar173._8_4_ = uVar1;
                auVar173._12_4_ = uVar1;
                auVar335 = vfmadd231ps_fma(auVar173,auVar111,auVar117);
                auVar402 = vmaxps_avx(auVar335,auVar402);
                auVar241 = vminps_avx(auVar402,auVar241);
                auVar111._0_4_ = auVar111._0_4_ * auVar241._0_4_;
                auVar111._4_4_ = fVar240 * auVar241._4_4_;
                auVar111._8_4_ = fVar478 * auVar241._8_4_;
                auVar111._12_4_ = fVar479 * auVar241._12_4_;
              }
              *pauVar42 = auVar111;
              pauVar42 = pauVar42 + 1;
              iVar50 = iVar50 + 8;
              bVar55 = iVar37 != iVar4;
              iVar37 = iVar37 + 1;
            } while (bVar55);
          }
          local_100 = local_100 + 1;
        } while (local_100 != _h);
      }
      if ((uVar3 == 4 && uVar33 == 0) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        local_100 = 0;
        auVar379 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar314._8_4_ = 0x3f000000;
        auVar314._0_8_ = 0x3f0000003f000000;
        auVar314._12_4_ = 0x3f000000;
        auVar324 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar331 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar321._8_4_ = 0x3d2aa9c1;
        auVar321._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar321._12_4_ = 0x3d2aa9c1;
        auVar438._8_4_ = 0xc2b0c0a5;
        auVar438._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar438._12_4_ = 0xc2b0c0a5;
        auVar451._8_4_ = 0x3ab743ce;
        auVar451._0_8_ = 0x3ab743ce3ab743ce;
        auVar451._12_4_ = 0x3ab743ce;
        do {
          if (-1 < iVar4) {
            pauVar42 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_100 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86_fma;
            iVar50 = 0;
            iVar37 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar118 = ZEXT816(0) << 0x40;
              }
              else {
                auVar118 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var5) + local_100 * 0x10);
              }
              if (0 < iVar26) {
                pauVar53 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * local_100 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                puVar38 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar50) * 4 + 4);
                uVar46 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    puVar31 = puVar38;
                    iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      uVar1 = puVar31[-3];
                      auVar459._4_4_ = uVar1;
                      auVar459._0_4_ = uVar1;
                      auVar459._8_4_ = uVar1;
                      auVar459._12_4_ = uVar1;
                      uVar1 = puVar31[-2];
                      auVar174._4_4_ = uVar1;
                      auVar174._0_4_ = uVar1;
                      auVar174._8_4_ = uVar1;
                      auVar174._12_4_ = uVar1;
                      uVar1 = puVar31[-1];
                      auVar288._4_4_ = uVar1;
                      auVar288._0_4_ = uVar1;
                      auVar288._8_4_ = uVar1;
                      auVar288._12_4_ = uVar1;
                      uVar1 = *puVar31;
                      auVar340._4_4_ = uVar1;
                      auVar340._0_4_ = uVar1;
                      auVar340._8_4_ = uVar1;
                      auVar340._12_4_ = uVar1;
                      auVar241 = vfmadd132ps_fma(auVar459,auVar118,*pauVar53);
                      auVar241 = vfmadd231ps_fma(auVar241,auVar174,pauVar53[1]);
                      auVar241 = vfmadd231ps_fma(auVar241,auVar288,pauVar53[2]);
                      auVar118 = vfmadd231ps_fma(auVar241,auVar340,pauVar53[3]);
                      pauVar53 = pauVar53 + 4;
                      puVar31 = puVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 2);
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  uVar46 = uVar46 + 1;
                  puVar38 = (undefined4 *)
                            ((long)puVar38 +
                            (long)local_a8.w *
                            CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar46 != uVar51);
              }
              p_Var5 = pp_Var6[-3];
              auVar241 = auVar324._0_16_;
              auVar335 = auVar379._0_16_;
              auVar402 = auVar331._0_16_;
              fVar57 = auVar118._4_4_;
              fVar56 = auVar118._8_4_;
              fVar480 = auVar118._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar118 = vmaxps_avx(auVar118,_DAT_0054e060);
                break;
              case 2:
                auVar241 = vmaxps_avx(auVar118,ZEXT816(0) << 0x40);
                auVar402 = vminps_avx(auVar118,ZEXT816(0) << 0x40);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar462._4_4_ = uVar1;
                auVar462._0_4_ = uVar1;
                auVar462._8_4_ = uVar1;
                auVar462._12_4_ = uVar1;
                auVar118 = vfmadd213ps_fma(auVar462,auVar402,auVar241);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar123._4_4_ = uVar1;
                auVar123._0_4_ = uVar1;
                auVar123._8_4_ = uVar1;
                auVar123._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar343._4_4_ = uVar1;
                auVar343._0_4_ = uVar1;
                auVar343._8_4_ = uVar1;
                auVar343._12_4_ = uVar1;
                auVar241 = vmaxps_avx(auVar118,auVar123);
                auVar118 = vminps_avx(auVar343,auVar241);
                break;
              case 4:
                auVar124._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
                auVar124._8_4_ = -fVar56;
                auVar124._12_4_ = -fVar480;
                auVar181._8_4_ = 0x42b0c0a5;
                auVar181._0_8_ = 0x42b0c0a542b0c0a5;
                auVar181._12_4_ = 0x42b0c0a5;
                auVar121 = vminps_avx(auVar124,auVar181);
                auVar182._8_4_ = 0xc2b0c0a5;
                auVar182._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar182._12_4_ = 0xc2b0c0a5;
                auVar341 = vmaxps_avx(auVar121,auVar182);
                auVar335 = vfmadd213ps_fma(auVar335,auVar341,auVar314);
                auVar460._0_4_ = (int)auVar335._0_4_;
                auVar460._4_4_ = (int)auVar335._4_4_;
                auVar460._8_4_ = (int)auVar335._8_4_;
                auVar460._12_4_ = (int)auVar335._12_4_;
                auVar121 = vcvtdq2ps_avx(auVar460);
                auVar335 = vcmpps_avx(auVar335,auVar121,1);
                auVar335 = vandps_avx(auVar335,auVar241);
                auVar335 = vsubps_avx(auVar121,auVar335);
                auVar183._8_4_ = 0x3f318000;
                auVar183._0_8_ = 0x3f3180003f318000;
                auVar183._12_4_ = 0x3f318000;
                auVar121 = vfmsub231ps_fma(auVar341,auVar335,auVar183);
                auVar184._8_4_ = 0x395e8083;
                auVar184._0_8_ = 0x395e8083395e8083;
                auVar184._12_4_ = 0x395e8083;
                auVar121 = vfmsub231ps_fma(auVar121,auVar335,auVar184);
                auVar461._0_4_ = auVar121._0_4_ * auVar121._0_4_;
                auVar461._4_4_ = auVar121._4_4_ * auVar121._4_4_;
                auVar461._8_4_ = auVar121._8_4_ * auVar121._8_4_;
                auVar461._12_4_ = auVar121._12_4_ * auVar121._12_4_;
                auVar185._8_4_ = 0x3ab743ce;
                auVar185._0_8_ = 0x3ab743ce3ab743ce;
                auVar185._12_4_ = 0x3ab743ce;
                auVar402 = vfmadd213ps_fma(auVar402,auVar121,auVar185);
                auVar186._8_4_ = 0x3c088908;
                auVar186._0_8_ = 0x3c0889083c088908;
                auVar186._12_4_ = 0x3c088908;
                auVar402 = vfmadd213ps_fma(auVar402,auVar121,auVar186);
                auVar402 = vfmadd213ps_fma(auVar402,auVar121,auVar321);
                auVar187._8_4_ = 0x3e2aaaaa;
                auVar187._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar187._12_4_ = 0x3e2aaaaa;
                auVar402 = vfmadd213ps_fma(auVar402,auVar121,auVar187);
                auVar402 = vfmadd213ps_fma(auVar402,auVar121,auVar314);
                auVar402 = vfmadd213ps_fma(auVar402,auVar461,auVar121);
                auVar125._0_4_ = auVar402._0_4_ + auVar324._0_4_;
                auVar125._4_4_ = auVar402._4_4_ + auVar324._4_4_;
                auVar125._8_4_ = auVar402._8_4_ + auVar324._8_4_;
                auVar125._12_4_ = auVar402._12_4_ + auVar324._12_4_;
                auVar344._0_4_ = (int)auVar335._0_4_;
                auVar344._4_4_ = (int)auVar335._4_4_;
                auVar344._8_4_ = (int)auVar335._8_4_;
                auVar344._12_4_ = (int)auVar335._12_4_;
                auVar402 = vpslld_avx(auVar344,0x17);
                auVar402 = vpaddd_avx(auVar402,auVar241);
                auVar335 = vfmadd213ps_fma(auVar402,auVar125,auVar241);
                auVar402 = vrcpps_avx(auVar335);
                auVar241 = vfmsub213ps_fma(auVar335,auVar402,auVar241);
                auVar118 = vfnmadd132ps_fma(auVar241,auVar402,auVar402);
                break;
              case 5:
                auVar119._8_4_ = 0x42b0c0a5;
                auVar119._0_8_ = 0x42b0c0a542b0c0a5;
                auVar119._12_4_ = 0x42b0c0a5;
                auVar121 = vminps_avx(auVar118,auVar119);
                auVar58 = vmaxps_avx(auVar438,auVar121);
                auVar121 = vfmadd213ps_fma(auVar335,auVar58,auVar314);
                auVar408._0_4_ = (int)auVar121._0_4_;
                auVar408._4_4_ = (int)auVar121._4_4_;
                auVar408._8_4_ = (int)auVar121._8_4_;
                auVar408._12_4_ = (int)auVar121._12_4_;
                auVar341 = vcvtdq2ps_avx(auVar408);
                auVar121 = vcmpps_avx(auVar121,auVar341,1);
                auVar121 = vandps_avx(auVar121,auVar241);
                auVar121 = vsubps_avx(auVar341,auVar121);
                auVar427._8_4_ = 0x3f318000;
                auVar427._0_8_ = 0x3f3180003f318000;
                auVar427._12_4_ = 0x3f318000;
                auVar341 = vfmsub231ps_fma(auVar58,auVar121,auVar427);
                auVar175._8_4_ = 0xb95e8083;
                auVar175._0_8_ = 0xb95e8083b95e8083;
                auVar175._12_4_ = 0xb95e8083;
                auVar58 = vfnmsub231ps_fma(auVar341,auVar121,auVar175);
                auVar409._0_4_ = auVar58._0_4_ * auVar58._0_4_;
                auVar409._4_4_ = auVar58._4_4_ * auVar58._4_4_;
                auVar409._8_4_ = auVar58._8_4_ * auVar58._8_4_;
                auVar409._12_4_ = auVar58._12_4_ * auVar58._12_4_;
                auVar341 = vfmadd213ps_fma(auVar402,auVar58,auVar451);
                auVar246._8_4_ = 0x3c088908;
                auVar246._0_8_ = 0x3c0889083c088908;
                auVar246._12_4_ = 0x3c088908;
                auVar341 = vfmadd213ps_fma(auVar341,auVar58,auVar246);
                auVar341 = vfmadd213ps_fma(auVar341,auVar58,auVar321);
                auVar289._8_4_ = 0x3e2aaaaa;
                auVar289._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar289._12_4_ = 0x3e2aaaaa;
                auVar341 = vfmadd213ps_fma(auVar341,auVar58,auVar289);
                auVar341 = vfmadd213ps_fma(auVar341,auVar58,auVar314);
                auVar341 = vfmadd213ps_fma(auVar341,auVar409,auVar58);
                auVar176._0_4_ = auVar341._0_4_ + auVar324._0_4_;
                auVar176._4_4_ = auVar341._4_4_ + auVar324._4_4_;
                auVar176._8_4_ = auVar341._8_4_ + auVar324._8_4_;
                auVar176._12_4_ = auVar341._12_4_ + auVar324._12_4_;
                auVar120._0_4_ = (int)auVar121._0_4_;
                auVar120._4_4_ = (int)auVar121._4_4_;
                auVar120._8_4_ = (int)auVar121._8_4_;
                auVar120._12_4_ = (int)auVar121._12_4_;
                auVar121 = vpslld_avx(auVar120,0x17);
                auVar121 = vpaddd_avx(auVar121,auVar241);
                auVar157 = vfmadd213ps_fma(auVar121,auVar176,auVar241);
                auVar177._8_4_ = 0x800000;
                auVar177._0_8_ = 0x80000000800000;
                auVar177._12_4_ = 0x800000;
                auVar121 = vmaxps_avx(auVar157,auVar177);
                auVar341 = vpsrld_avx(auVar121,0x17);
                auVar290._8_4_ = 0xffffff82;
                auVar290._0_8_ = 0xffffff82ffffff82;
                auVar290._12_4_ = 0xffffff82;
                auVar341 = vpaddd_avx(auVar341,auVar290);
                auVar291._8_4_ = 0x807fffff;
                auVar291._0_8_ = 0x807fffff807fffff;
                auVar291._12_4_ = 0x807fffff;
                auVar121 = vandps_avx(auVar121,auVar291);
                auVar105 = vorps_avx(auVar121,auVar314);
                auVar58 = vcvtdq2ps_avx(auVar341);
                auVar292._8_4_ = 0x3f3504f3;
                auVar292._0_8_ = 0x3f3504f33f3504f3;
                auVar292._12_4_ = 0x3f3504f3;
                auVar341 = vcmpps_avx(auVar105,auVar292,1);
                auVar121 = vandps_avx(auVar341,auVar105);
                auVar178._0_4_ = auVar105._0_4_ + -1.0 + auVar121._0_4_;
                auVar178._4_4_ = auVar105._4_4_ + -1.0 + auVar121._4_4_;
                auVar178._8_4_ = auVar105._8_4_ + -1.0 + auVar121._8_4_;
                auVar178._12_4_ = auVar105._12_4_ + -1.0 + auVar121._12_4_;
                auVar241 = vandps_avx(auVar341,auVar241);
                auVar121 = vsubps_avx(auVar58,auVar241);
                auVar342._0_4_ = auVar178._0_4_ * auVar178._0_4_;
                auVar342._4_4_ = auVar178._4_4_ * auVar178._4_4_;
                auVar342._8_4_ = auVar178._8_4_ * auVar178._8_4_;
                auVar342._12_4_ = auVar178._12_4_ * auVar178._12_4_;
                auVar410._8_4_ = 0x3d9021bb;
                auVar410._0_8_ = 0x3d9021bb3d9021bb;
                auVar410._12_4_ = 0x3d9021bb;
                auVar67._8_4_ = 0xbdebd1b8;
                auVar67._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar67._12_4_ = 0xbdebd1b8;
                auVar241 = vfmadd213ps_fma(auVar410,auVar178,auVar67);
                auVar68._8_4_ = 0x3def251a;
                auVar68._0_8_ = 0x3def251a3def251a;
                auVar68._12_4_ = 0x3def251a;
                auVar241 = vfmadd213ps_fma(auVar241,auVar178,auVar68);
                auVar69._8_4_ = 0xbdfe5d4f;
                auVar69._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar69._12_4_ = 0xbdfe5d4f;
                auVar241 = vfmadd213ps_fma(auVar241,auVar178,auVar69);
                auVar70._8_4_ = 0x3e11e9bf;
                auVar70._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar70._12_4_ = 0x3e11e9bf;
                auVar241 = vfmadd213ps_fma(auVar241,auVar178,auVar70);
                auVar71._8_4_ = 0xbe2aae50;
                auVar71._0_8_ = 0xbe2aae50be2aae50;
                auVar71._12_4_ = 0xbe2aae50;
                auVar241 = vfmadd213ps_fma(auVar241,auVar178,auVar71);
                auVar72._8_4_ = 0x3e4cceac;
                auVar72._0_8_ = 0x3e4cceac3e4cceac;
                auVar72._12_4_ = 0x3e4cceac;
                auVar241 = vfmadd213ps_fma(auVar241,auVar178,auVar72);
                auVar73._8_4_ = 0xbe7ffffc;
                auVar73._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar73._12_4_ = 0xbe7ffffc;
                auVar241 = vfmadd213ps_fma(auVar241,auVar178,auVar73);
                auVar74._8_4_ = 0x3eaaaaaa;
                auVar74._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar74._12_4_ = 0x3eaaaaaa;
                auVar241 = vfmadd213ps_fma(auVar241,auVar178,auVar74);
                auVar390._0_4_ = auVar342._0_4_ * auVar178._0_4_ * auVar241._0_4_;
                auVar390._4_4_ = auVar342._4_4_ * auVar178._4_4_ * auVar241._4_4_;
                auVar390._8_4_ = auVar342._8_4_ * auVar178._8_4_ * auVar241._8_4_;
                auVar390._12_4_ = auVar342._12_4_ * auVar178._12_4_ * auVar241._12_4_;
                auVar411._8_4_ = 0xb95e8083;
                auVar411._0_8_ = 0xb95e8083b95e8083;
                auVar411._12_4_ = 0xb95e8083;
                auVar241 = vfmadd231ps_fma(auVar390,auVar121,auVar411);
                auVar341 = vfmsub231ps_fma(auVar241,auVar314,auVar342);
                auVar241 = vcmpps_avx(auVar157,ZEXT816(0) << 0x20,2);
                auVar341 = vsubps_avx(auVar341,auVar178);
                auVar428._8_4_ = 0x42b0c0a5;
                auVar428._0_8_ = 0x42b0c0a542b0c0a5;
                auVar428._12_4_ = 0x42b0c0a5;
                auVar75._8_4_ = 0x3f800000;
                auVar75._0_8_ = 0x3f8000003f800000;
                auVar75._12_4_ = 0x3f800000;
                auVar324 = ZEXT1664(auVar75);
                auVar121 = vfnmadd231ps_fma(auVar341,auVar427,auVar121);
                auVar179._0_4_ = auVar121._0_4_ + auVar121._0_4_;
                auVar179._4_4_ = auVar121._4_4_ + auVar121._4_4_;
                auVar179._8_4_ = auVar121._8_4_ + auVar121._8_4_;
                auVar179._12_4_ = auVar121._12_4_ + auVar121._12_4_;
                auVar293._8_4_ = 0x7fffffff;
                auVar293._0_8_ = 0x7fffffff7fffffff;
                auVar293._12_4_ = 0x7fffffff;
                auVar241 = vblendvps_avx(auVar179,auVar293,auVar241);
                auVar241 = vminps_avx(auVar428,auVar241);
                auVar121 = vmaxps_avx(auVar438,auVar241);
                auVar379 = ZEXT1664(auVar335);
                auVar241 = vfmadd213ps_fma(auVar335,auVar121,auVar314);
                auVar294._0_4_ = (int)auVar241._0_4_;
                auVar294._4_4_ = (int)auVar241._4_4_;
                auVar294._8_4_ = (int)auVar241._8_4_;
                auVar294._12_4_ = (int)auVar241._12_4_;
                auVar335 = vcvtdq2ps_avx(auVar294);
                auVar241 = vcmpps_avx(auVar241,auVar335,1);
                auVar241 = vandps_avx(auVar241,auVar75);
                auVar241 = vsubps_avx(auVar335,auVar241);
                auVar335 = vfmsub231ps_fma(auVar121,auVar241,auVar427);
                auVar295._8_4_ = 0xb95e8083;
                auVar295._0_8_ = 0xb95e8083b95e8083;
                auVar295._12_4_ = 0xb95e8083;
                auVar335 = vfnmsub231ps_fma(auVar335,auVar241,auVar295);
                auVar296._0_4_ = auVar335._0_4_ * auVar335._0_4_;
                auVar296._4_4_ = auVar335._4_4_ * auVar335._4_4_;
                auVar296._8_4_ = auVar335._8_4_ * auVar335._8_4_;
                auVar296._12_4_ = auVar335._12_4_ * auVar335._12_4_;
                auVar331 = ZEXT1664(auVar402);
                auVar402 = vfmadd213ps_fma(auVar402,auVar335,auVar451);
                auVar402 = vfmadd213ps_fma(auVar402,auVar335,auVar246);
                auVar402 = vfmadd213ps_fma(auVar402,auVar335,auVar321);
                auVar247._8_4_ = 0x3e2aaaaa;
                auVar247._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar247._12_4_ = 0x3e2aaaaa;
                auVar402 = vfmadd213ps_fma(auVar402,auVar335,auVar247);
                auVar402 = vfmadd213ps_fma(auVar402,auVar335,auVar314);
                auVar402 = vfmadd213ps_fma(auVar402,auVar296,auVar335);
                auVar122._0_4_ = auVar402._0_4_ + 1.0;
                auVar122._4_4_ = auVar402._4_4_ + 1.0;
                auVar122._8_4_ = auVar402._8_4_ + 1.0;
                auVar122._12_4_ = auVar402._12_4_ + 1.0;
                auVar180._0_4_ = (int)auVar241._0_4_;
                auVar180._4_4_ = (int)auVar241._4_4_;
                auVar180._8_4_ = (int)auVar241._8_4_;
                auVar180._12_4_ = (int)auVar241._12_4_;
                auVar241 = vpslld_avx(auVar180,0x17);
                auVar241 = vpaddd_avx(auVar241,auVar75);
                auVar402 = vfmadd213ps_fma(auVar241,auVar122,auVar75);
                auVar241 = vrcpps_avx(auVar402);
                auVar297._0_4_ = auVar241._0_4_ + auVar241._0_4_;
                auVar297._4_4_ = auVar241._4_4_ + auVar241._4_4_;
                auVar297._8_4_ = auVar241._8_4_ + auVar241._8_4_;
                auVar297._12_4_ = auVar241._12_4_ + auVar241._12_4_;
                auVar248._8_4_ = 0x40000000;
                auVar248._0_8_ = 0x4000000040000000;
                auVar248._12_4_ = 0x40000000;
                auVar402 = vfmsub213ps_fma(auVar402,auVar297,auVar248);
                auVar241 = vfnmadd213ps_fma(auVar402,auVar241,auVar297);
                auVar118 = vfmsub231ps_fma(auVar118,auVar118,auVar241);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar126._4_4_ = uVar1;
                auVar126._0_4_ = uVar1;
                auVar126._8_4_ = uVar1;
                auVar126._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar188._4_4_ = uVar1;
                auVar188._0_4_ = uVar1;
                auVar188._8_4_ = uVar1;
                auVar188._12_4_ = uVar1;
                auVar402 = vfmadd231ps_fma(auVar188,auVar118,auVar126);
                auVar402 = vmaxps_avx(auVar402,_DAT_0054e060);
                auVar241 = vminps_avx(auVar402,auVar241);
                auVar118._0_4_ = auVar118._0_4_ * auVar241._0_4_;
                auVar118._4_4_ = fVar57 * auVar241._4_4_;
                auVar118._8_4_ = fVar56 * auVar241._8_4_;
                auVar118._12_4_ = fVar480 * auVar241._12_4_;
              }
              *pauVar42 = auVar118;
              pauVar42 = pauVar42 + 1;
              iVar50 = iVar50 + 4;
              bVar55 = iVar37 != iVar4;
              iVar37 = iVar37 + 1;
            } while (bVar55);
          }
          local_100 = local_100 + 1;
        } while (local_100 != _h);
      }
      if ((uVar33 == 0 && uVar3 == 1) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        uVar46 = 0;
        auVar379 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar324 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar331 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (-1 < iVar4) {
            pauVar42 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar46 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86_fma;
            iVar37 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar345 = ZEXT816(0) << 0x40;
              }
              else {
                auVar345 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var5) + uVar46 * 0x10);
              }
              auVar476 = ZEXT1664(auVar345);
              if (0 < iVar26) {
                pauVar53 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * uVar46 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                puVar38 = (undefined4 *)
                          ((long)(_func_int ***)local_a8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar37) * 4);
                uVar34 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    puVar31 = puVar38;
                    iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      uVar1 = *puVar31;
                      auVar127._4_4_ = uVar1;
                      auVar127._0_4_ = uVar1;
                      auVar127._8_4_ = uVar1;
                      auVar127._12_4_ = uVar1;
                      auVar241 = vfmadd231ps_fma(auVar476._0_16_,auVar127,*pauVar53);
                      auVar476 = ZEXT1664(auVar241);
                      pauVar53 = pauVar53 + 1;
                      puVar31 = puVar31 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  auVar345 = auVar476._0_16_;
                  uVar34 = uVar34 + 1;
                  puVar38 = (undefined4 *)
                            ((long)puVar38 +
                            (long)local_a8.w *
                            CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar34 != uVar51);
              }
              p_Var5 = pp_Var6[-3];
              auVar335 = auVar379._0_16_;
              auVar402 = auVar331._0_16_;
              auVar241 = auVar324._0_16_;
              fVar57 = auVar331._0_4_;
              fVar56 = auVar331._4_4_;
              fVar480 = auVar331._8_4_;
              fVar2 = auVar331._12_4_;
              fVar240 = auVar345._4_4_;
              fVar478 = auVar345._8_4_;
              fVar479 = auVar345._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar345 = vmaxps_avx(auVar345,auVar335);
                break;
              case 2:
                auVar241 = vmaxps_avx(auVar345,auVar335);
                auVar402 = vminps_avx(auVar345,auVar335);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar348._4_4_ = uVar1;
                auVar348._0_4_ = uVar1;
                auVar348._8_4_ = uVar1;
                auVar348._12_4_ = uVar1;
                auVar345 = vfmadd213ps_fma(auVar348,auVar402,auVar241);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar130._4_4_ = uVar1;
                auVar130._0_4_ = uVar1;
                auVar130._8_4_ = uVar1;
                auVar130._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar466._4_4_ = uVar1;
                auVar466._0_4_ = uVar1;
                auVar466._8_4_ = uVar1;
                auVar466._12_4_ = uVar1;
                auVar241 = vmaxps_avx(auVar345,auVar130);
                auVar345 = vminps_avx(auVar466,auVar241);
                break;
              case 4:
                auVar131._0_8_ = auVar345._0_8_ ^ 0x8000000080000000;
                auVar131._8_4_ = -fVar478;
                auVar131._12_4_ = -fVar479;
                auVar196._8_4_ = 0x42b0c0a5;
                auVar196._0_8_ = 0x42b0c0a542b0c0a5;
                auVar196._12_4_ = 0x42b0c0a5;
                auVar335 = vminps_avx(auVar131,auVar196);
                auVar197._8_4_ = 0xc2b0c0a5;
                auVar197._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar197._12_4_ = 0xc2b0c0a5;
                auVar341 = vmaxps_avx(auVar335,auVar197);
                auVar346._8_4_ = 0x3fb8aa3b;
                auVar346._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar346._12_4_ = 0x3fb8aa3b;
                auVar335 = vfmadd213ps_fma(auVar346,auVar341,auVar241);
                auVar467._0_4_ = (int)auVar335._0_4_;
                auVar467._4_4_ = (int)auVar335._4_4_;
                auVar467._8_4_ = (int)auVar335._8_4_;
                auVar467._12_4_ = (int)auVar335._12_4_;
                auVar121 = vcvtdq2ps_avx(auVar467);
                auVar335 = vcmpps_avx(auVar335,auVar121,1);
                auVar335 = vandps_avx(auVar335,auVar402);
                auVar335 = vsubps_avx(auVar121,auVar335);
                auVar77._8_4_ = 0x3f318000;
                auVar77._0_8_ = 0x3f3180003f318000;
                auVar77._12_4_ = 0x3f318000;
                auVar121 = vfmsub231ps_fma(auVar341,auVar335,auVar77);
                auVar198._8_4_ = 0x395e8083;
                auVar198._0_8_ = 0x395e8083395e8083;
                auVar198._12_4_ = 0x395e8083;
                auVar341 = vfmsub231ps_fma(auVar121,auVar335,auVar198);
                auVar468._0_4_ = auVar341._0_4_ * auVar341._0_4_;
                auVar468._4_4_ = auVar341._4_4_ * auVar341._4_4_;
                auVar468._8_4_ = auVar341._8_4_ * auVar341._8_4_;
                auVar468._12_4_ = auVar341._12_4_ * auVar341._12_4_;
                auVar413._8_4_ = 0x39506967;
                auVar413._0_8_ = 0x3950696739506967;
                auVar413._12_4_ = 0x39506967;
                auVar199._8_4_ = 0x3ab743ce;
                auVar199._0_8_ = 0x3ab743ce3ab743ce;
                auVar199._12_4_ = 0x3ab743ce;
                auVar121 = vfmadd213ps_fma(auVar413,auVar341,auVar199);
                auVar200._8_4_ = 0x3c088908;
                auVar200._0_8_ = 0x3c0889083c088908;
                auVar200._12_4_ = 0x3c088908;
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar200);
                auVar78._8_4_ = 0x3d2aa9c1;
                auVar78._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar78._12_4_ = 0x3d2aa9c1;
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar78);
                auVar79._8_4_ = 0x3e2aaaaa;
                auVar79._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar79._12_4_ = 0x3e2aaaaa;
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar79);
                auVar241 = vfmadd213ps_fma(auVar121,auVar341,auVar241);
                auVar241 = vfmadd213ps_fma(auVar241,auVar468,auVar341);
                auVar132._0_4_ = auVar241._0_4_ + fVar57;
                auVar132._4_4_ = auVar241._4_4_ + fVar56;
                auVar132._8_4_ = auVar241._8_4_ + fVar480;
                auVar132._12_4_ = auVar241._12_4_ + fVar2;
                auVar379 = ZEXT864(0) << 0x20;
                auVar347._0_4_ = (int)auVar335._0_4_;
                auVar347._4_4_ = (int)auVar335._4_4_;
                auVar347._8_4_ = (int)auVar335._8_4_;
                auVar347._12_4_ = (int)auVar335._12_4_;
                auVar241 = vpslld_avx(auVar347,0x17);
                auVar241 = vpaddd_avx(auVar241,auVar402);
                auVar335 = vfmadd213ps_fma(auVar241,auVar132,auVar402);
                auVar241 = vrcpps_avx(auVar335);
                auVar402 = vfmsub213ps_fma(auVar335,auVar241,auVar402);
                auVar345 = vfnmadd132ps_fma(auVar402,auVar241,auVar241);
                break;
              case 5:
                auVar429._8_4_ = 0x42b0c0a5;
                auVar429._0_8_ = 0x42b0c0a542b0c0a5;
                auVar429._12_4_ = 0x42b0c0a5;
                auVar335 = vminps_avx(auVar345,auVar429);
                auVar439._8_4_ = 0xc2b0c0a5;
                auVar439._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar439._12_4_ = 0xc2b0c0a5;
                auVar341 = vmaxps_avx(auVar439,auVar335);
                auVar446._8_4_ = 0x3fb8aa3b;
                auVar446._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar446._12_4_ = 0x3fb8aa3b;
                auVar335 = vfmadd213ps_fma(auVar446,auVar341,auVar241);
                auVar463._0_4_ = (int)auVar335._0_4_;
                auVar463._4_4_ = (int)auVar335._4_4_;
                auVar463._8_4_ = (int)auVar335._8_4_;
                auVar463._12_4_ = (int)auVar335._12_4_;
                auVar121 = vcvtdq2ps_avx(auVar463);
                auVar335 = vcmpps_avx(auVar335,auVar121,1);
                auVar335 = vandps_avx(auVar335,auVar402);
                auVar335 = vsubps_avx(auVar121,auVar335);
                auVar430._8_4_ = 0x3f318000;
                auVar430._0_8_ = 0x3f3180003f318000;
                auVar430._12_4_ = 0x3f318000;
                auVar121 = vfmsub231ps_fma(auVar341,auVar335,auVar430);
                auVar440._8_4_ = 0xb95e8083;
                auVar440._0_8_ = 0xb95e8083b95e8083;
                auVar440._12_4_ = 0xb95e8083;
                auVar341 = vfnmsub231ps_fma(auVar121,auVar335,auVar440);
                auVar464._0_4_ = auVar341._0_4_ * auVar341._0_4_;
                auVar464._4_4_ = auVar341._4_4_ * auVar341._4_4_;
                auVar464._8_4_ = auVar341._8_4_ * auVar341._8_4_;
                auVar464._12_4_ = auVar341._12_4_ * auVar341._12_4_;
                auVar452._8_4_ = 0x39506967;
                auVar452._0_8_ = 0x3950696739506967;
                auVar452._12_4_ = 0x39506967;
                auVar249._8_4_ = 0x3ab743ce;
                auVar249._0_8_ = 0x3ab743ce3ab743ce;
                auVar249._12_4_ = 0x3ab743ce;
                auVar121 = vfmadd213ps_fma(auVar452,auVar341,auVar249);
                auVar326._8_4_ = 0x3c088908;
                auVar326._0_8_ = 0x3c0889083c088908;
                auVar326._12_4_ = 0x3c088908;
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar326);
                auVar315._8_4_ = 0x3d2aa9c1;
                auVar315._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar315._12_4_ = 0x3d2aa9c1;
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar315);
                auVar327._8_4_ = 0x3e2aaaaa;
                auVar327._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar327._12_4_ = 0x3e2aaaaa;
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar327);
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar241);
                auVar121 = vfmadd213ps_fma(auVar121,auVar464,auVar341);
                auVar189._0_4_ = auVar121._0_4_ + fVar57;
                auVar189._4_4_ = auVar121._4_4_ + fVar56;
                auVar189._8_4_ = auVar121._8_4_ + fVar480;
                auVar189._12_4_ = auVar121._12_4_ + fVar2;
                auVar128._0_4_ = (int)auVar335._0_4_;
                auVar128._4_4_ = (int)auVar335._4_4_;
                auVar128._8_4_ = (int)auVar335._8_4_;
                auVar128._12_4_ = (int)auVar335._12_4_;
                auVar335 = vpslld_avx(auVar128,0x17);
                auVar335 = vpaddd_avx(auVar335,auVar402);
                auVar105 = vfmadd213ps_fma(auVar335,auVar189,auVar402);
                auVar190._8_4_ = 0x800000;
                auVar190._0_8_ = 0x80000000800000;
                auVar190._12_4_ = 0x800000;
                auVar335 = vmaxps_avx(auVar105,auVar190);
                auVar121 = vpsrld_avx(auVar335,0x17);
                auVar298._8_4_ = 0xffffff82;
                auVar298._0_8_ = 0xffffff82ffffff82;
                auVar298._12_4_ = 0xffffff82;
                auVar121 = vpaddd_avx(auVar121,auVar298);
                auVar299._8_4_ = 0x807fffff;
                auVar299._0_8_ = 0x807fffff807fffff;
                auVar299._12_4_ = 0x807fffff;
                auVar335 = vandps_avx(auVar335,auVar299);
                auVar58 = vorps_avx(auVar335,auVar241);
                auVar341 = vcvtdq2ps_avx(auVar121);
                auVar300._8_4_ = 0x3f3504f3;
                auVar300._0_8_ = 0x3f3504f33f3504f3;
                auVar300._12_4_ = 0x3f3504f3;
                auVar121 = vcmpps_avx(auVar58,auVar300,1);
                auVar335 = vandps_avx(auVar121,auVar58);
                auVar191._0_4_ = auVar58._0_4_ + -1.0 + auVar335._0_4_;
                auVar191._4_4_ = auVar58._4_4_ + -1.0 + auVar335._4_4_;
                auVar191._8_4_ = auVar58._8_4_ + -1.0 + auVar335._8_4_;
                auVar191._12_4_ = auVar58._12_4_ + -1.0 + auVar335._12_4_;
                auVar335 = vandps_avx(auVar121,auVar402);
                auVar121 = vsubps_avx(auVar341,auVar335);
                auVar412._0_4_ = auVar191._0_4_ * auVar191._0_4_;
                auVar412._4_4_ = auVar191._4_4_ * auVar191._4_4_;
                auVar412._8_4_ = auVar191._8_4_ * auVar191._8_4_;
                auVar412._12_4_ = auVar191._12_4_ * auVar191._12_4_;
                auVar465._8_4_ = 0x3d9021bb;
                auVar465._0_8_ = 0x3d9021bb3d9021bb;
                auVar465._12_4_ = 0x3d9021bb;
                auVar391._8_4_ = 0xbdebd1b8;
                auVar391._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar391._12_4_ = 0xbdebd1b8;
                auVar335 = vfmadd213ps_fma(auVar465,auVar191,auVar391);
                auVar392._8_4_ = 0x3def251a;
                auVar392._0_8_ = 0x3def251a3def251a;
                auVar392._12_4_ = 0x3def251a;
                auVar335 = vfmadd213ps_fma(auVar335,auVar191,auVar392);
                auVar393._8_4_ = 0xbdfe5d4f;
                auVar393._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar393._12_4_ = 0xbdfe5d4f;
                auVar335 = vfmadd213ps_fma(auVar335,auVar191,auVar393);
                auVar394._8_4_ = 0x3e11e9bf;
                auVar394._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar394._12_4_ = 0x3e11e9bf;
                auVar335 = vfmadd213ps_fma(auVar335,auVar191,auVar394);
                auVar395._8_4_ = 0xbe2aae50;
                auVar395._0_8_ = 0xbe2aae50be2aae50;
                auVar395._12_4_ = 0xbe2aae50;
                auVar335 = vfmadd213ps_fma(auVar335,auVar191,auVar395);
                auVar396._8_4_ = 0x3e4cceac;
                auVar396._0_8_ = 0x3e4cceac3e4cceac;
                auVar396._12_4_ = 0x3e4cceac;
                auVar335 = vfmadd213ps_fma(auVar335,auVar191,auVar396);
                auVar397._8_4_ = 0xbe7ffffc;
                auVar397._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar397._12_4_ = 0xbe7ffffc;
                auVar335 = vfmadd213ps_fma(auVar335,auVar191,auVar397);
                auVar398._8_4_ = 0x3eaaaaaa;
                auVar398._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar398._12_4_ = 0x3eaaaaaa;
                auVar335 = vfmadd213ps_fma(auVar335,auVar191,auVar398);
                auVar399._0_4_ = auVar412._0_4_ * auVar191._0_4_ * auVar335._0_4_;
                auVar399._4_4_ = auVar412._4_4_ * auVar191._4_4_ * auVar335._4_4_;
                auVar399._8_4_ = auVar412._8_4_ * auVar191._8_4_ * auVar335._8_4_;
                auVar399._12_4_ = auVar412._12_4_ * auVar191._12_4_ * auVar335._12_4_;
                auVar335 = vfmadd231ps_fma(auVar399,auVar121,auVar440);
                auVar341 = vfmsub231ps_fma(auVar335,auVar241,auVar412);
                auVar23._12_4_ = 0;
                auVar23._0_12_ = ZEXT412(0);
                auVar379 = ZEXT1264(ZEXT412(0)) << 0x20;
                auVar335 = vcmpps_avx(auVar105,auVar23 << 0x20,2);
                auVar341 = vsubps_avx(auVar341,auVar191);
                auVar121 = vfnmadd231ps_fma(auVar341,auVar430,auVar121);
                auVar192._0_4_ = auVar121._0_4_ + auVar121._0_4_;
                auVar192._4_4_ = auVar121._4_4_ + auVar121._4_4_;
                auVar192._8_4_ = auVar121._8_4_ + auVar121._8_4_;
                auVar192._12_4_ = auVar121._12_4_ + auVar121._12_4_;
                auVar301._8_4_ = 0x7fffffff;
                auVar301._0_8_ = 0x7fffffff7fffffff;
                auVar301._12_4_ = 0x7fffffff;
                auVar335 = vblendvps_avx(auVar192,auVar301,auVar335);
                auVar193._8_4_ = 0x42b0c0a5;
                auVar193._0_8_ = 0x42b0c0a542b0c0a5;
                auVar193._12_4_ = 0x42b0c0a5;
                auVar335 = vminps_avx(auVar335,auVar193);
                auVar194._8_4_ = 0xc2b0c0a5;
                auVar194._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar194._12_4_ = 0xc2b0c0a5;
                auVar341 = vmaxps_avx(auVar335,auVar194);
                auVar335 = vfmadd213ps_fma(auVar446,auVar341,auVar241);
                auVar302._0_4_ = (int)auVar335._0_4_;
                auVar302._4_4_ = (int)auVar335._4_4_;
                auVar302._8_4_ = (int)auVar335._8_4_;
                auVar302._12_4_ = (int)auVar335._12_4_;
                auVar121 = vcvtdq2ps_avx(auVar302);
                auVar335 = vcmpps_avx(auVar335,auVar121,1);
                auVar335 = vandps_avx(auVar335,auVar402);
                auVar335 = vsubps_avx(auVar121,auVar335);
                auVar121 = vfmsub231ps_fma(auVar341,auVar335,auVar430);
                auVar341 = vfnmsub231ps_fma(auVar121,auVar335,auVar440);
                auVar303._0_4_ = auVar341._0_4_ * auVar341._0_4_;
                auVar303._4_4_ = auVar341._4_4_ * auVar341._4_4_;
                auVar303._8_4_ = auVar341._8_4_ * auVar341._8_4_;
                auVar303._12_4_ = auVar341._12_4_ * auVar341._12_4_;
                auVar121 = vfmadd213ps_fma(auVar452,auVar341,auVar249);
                auVar324 = ZEXT1664(auVar241);
                auVar322._8_4_ = 0x3c088908;
                auVar322._0_8_ = 0x3c0889083c088908;
                auVar322._12_4_ = 0x3c088908;
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar322);
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar315);
                auVar331 = ZEXT1664(auVar402);
                auVar121 = vfmadd213ps_fma(auVar121,auVar341,auVar327);
                auVar241 = vfmadd213ps_fma(auVar121,auVar341,auVar241);
                auVar241 = vfmadd213ps_fma(auVar241,auVar303,auVar341);
                auVar129._0_4_ = auVar241._0_4_ + fVar57;
                auVar129._4_4_ = auVar241._4_4_ + fVar56;
                auVar129._8_4_ = auVar241._8_4_ + fVar480;
                auVar129._12_4_ = auVar241._12_4_ + fVar2;
                auVar195._0_4_ = (int)auVar335._0_4_;
                auVar195._4_4_ = (int)auVar335._4_4_;
                auVar195._8_4_ = (int)auVar335._8_4_;
                auVar195._12_4_ = (int)auVar335._12_4_;
                auVar241 = vpslld_avx(auVar195,0x17);
                auVar241 = vpaddd_avx(auVar241,auVar402);
                auVar402 = vfmadd213ps_fma(auVar241,auVar129,auVar402);
                auVar241 = vrcpps_avx(auVar402);
                auVar304._0_4_ = auVar241._0_4_ + auVar241._0_4_;
                auVar304._4_4_ = auVar241._4_4_ + auVar241._4_4_;
                auVar304._8_4_ = auVar241._8_4_ + auVar241._8_4_;
                auVar304._12_4_ = auVar241._12_4_ + auVar241._12_4_;
                auVar76._8_4_ = 0x40000000;
                auVar76._0_8_ = 0x4000000040000000;
                auVar76._12_4_ = 0x40000000;
                auVar402 = vfmsub213ps_fma(auVar402,auVar304,auVar76);
                auVar241 = vfnmadd213ps_fma(auVar402,auVar241,auVar304);
                auVar345 = vfmsub231ps_fma(auVar345,auVar345,auVar241);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                auVar133._4_4_ = uVar1;
                auVar133._0_4_ = uVar1;
                auVar133._8_4_ = uVar1;
                auVar133._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar201._4_4_ = uVar1;
                auVar201._0_4_ = uVar1;
                auVar201._8_4_ = uVar1;
                auVar201._12_4_ = uVar1;
                auVar241 = vfmadd231ps_fma(auVar201,auVar345,auVar133);
                auVar241 = vmaxps_avx(auVar335,auVar241);
                auVar241 = vminps_avx(auVar241,auVar402);
                auVar345._0_4_ = auVar345._0_4_ * auVar241._0_4_;
                auVar345._4_4_ = fVar240 * auVar241._4_4_;
                auVar345._8_4_ = fVar478 * auVar241._8_4_;
                auVar345._12_4_ = fVar479 * auVar241._12_4_;
              }
              *pauVar42 = auVar345;
              pauVar42 = pauVar42 + 1;
              bVar55 = iVar37 != iVar4;
              iVar37 = iVar37 + 1;
            } while (bVar55);
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != _h);
      }
      if ((uVar3 == 4 && uVar30 == 0) && 0 < (int)_h) {
        local_48 = (long)top_blob->w * top_blob->elemsize;
        local_50 = top_blob->data;
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        local_58 = (this->weight_data_packed).data;
        local_60 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_40 = (ulong)_h;
        uVar46 = 0;
        do {
          pvVar25 = local_50;
          pvVar9 = local_a8.data;
          if (-1 < iVar4) {
            lVar28 = local_48 * uVar46;
            pfVar29 = (float *)(local_60 * uVar46 + (long)local_58);
            lVar54 = (long)local_a8.w;
            lVar44 = CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize);
            pp_Var7 = this->_vptr_Convolution1D_x86_fma;
            iVar37 = 0;
            uVar34 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar324 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar324 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) +
                                            uVar46 * 4));
              }
              auVar241 = auVar324._0_16_;
              if (0 < iVar26) {
                p_Var5 = pp_Var7[-3];
                pfVar35 = (float *)((long)(_func_int ***)pvVar9 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar37) * 4);
                uVar39 = 0;
                pfVar43 = pfVar29;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    pfVar48 = pfVar35;
                    iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      auVar80._0_4_ = *pfVar43 * *pfVar48;
                      auVar80._4_4_ = pfVar43[1] * pfVar48[1];
                      auVar80._8_4_ = pfVar43[2] * pfVar48[2];
                      auVar80._12_4_ = pfVar43[3] * pfVar48[3];
                      auVar241 = vshufpd_avx(auVar80,auVar80,1);
                      auVar81._0_4_ = auVar241._0_4_ + auVar80._0_4_;
                      auVar81._4_4_ = auVar241._4_4_ + auVar80._4_4_;
                      auVar81._8_4_ = auVar241._8_4_ + auVar80._8_4_;
                      auVar81._12_4_ = auVar241._12_4_ + auVar80._12_4_;
                      auVar241 = vmovshdup_avx(auVar81);
                      auVar324 = ZEXT464((uint)(auVar241._0_4_ + auVar324._0_4_ + auVar81._0_4_));
                      pfVar43 = pfVar43 + 4;
                      pfVar48 = pfVar48 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 2);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  auVar241 = auVar324._0_16_;
                  uVar39 = uVar39 + 1;
                  pfVar35 = (float *)((long)pfVar35 + lVar54 * lVar44);
                } while (uVar39 != uVar51);
              }
              p_Var5 = pp_Var6[-3];
              fVar56 = auVar241._0_4_;
              fVar57 = fVar56;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar241 = vmaxss_avx(auVar241,ZEXT416(0));
                fVar57 = auVar241._0_4_;
                break;
              case 2:
                auVar241 = vcmpss_avx(ZEXT816(0) << 0x40,auVar241,1);
                auVar203._8_4_ = 0x3f800000;
                auVar203._0_8_ = 0x3f8000003f800000;
                auVar203._12_4_ = 0x3f800000;
                auVar241 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var5)),
                                         auVar203,auVar241);
                fVar57 = auVar241._0_4_ * fVar56;
                break;
              case 3:
                fVar56 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar241 = vmaxss_avx(auVar241,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var5)
                                                      ));
                fVar57 = auVar241._0_4_;
                if (fVar56 < auVar241._0_4_) {
                  fVar57 = fVar56;
                }
                break;
              case 4:
                auVar241 = vminss_avx(auVar241,ZEXT416(0x42b0c0a5));
                auVar134._0_8_ = auVar241._0_8_ ^ 0x8000000080000000;
                auVar134._8_4_ = auVar241._8_4_ ^ 0x80000000;
                auVar134._12_4_ = auVar241._12_4_ ^ 0x80000000;
                auVar241 = vcmpss_avx(auVar241,ZEXT416(0xc2b0c0a5),1);
                auVar202._8_4_ = 0x42b0c0a5;
                auVar202._0_8_ = 0x42b0c0a542b0c0a5;
                auVar202._12_4_ = 0x42b0c0a5;
                auVar241 = vblendvps_avx(auVar134,auVar202,auVar241);
                fVar57 = expf(auVar241._0_4_);
                fVar57 = 1.0 / (fVar57 + 1.0);
                break;
              case 5:
                fVar57 = expf(fVar56);
                fVar57 = logf(fVar57 + 1.0);
                fVar57 = tanhf(fVar57);
                fVar57 = fVar57 * fVar56;
                break;
              case 6:
                fVar480 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar2 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar240 = -fVar2 / fVar480;
                fVar57 = 0.0;
                if ((fVar240 <= fVar56) && (fVar57 = fVar56, fVar56 <= fVar240 + 1.0 / fVar480)) {
                  auVar241 = vfmadd213ss_fma(ZEXT416((uint)fVar480),auVar241,ZEXT416((uint)fVar2));
                  fVar57 = auVar241._0_4_ * fVar56;
                }
              }
              *(float *)((long)pvVar25 + uVar34 * 4 + lVar28) = fVar57;
              uVar34 = uVar34 + 1;
              iVar37 = iVar37 + 4;
            } while (uVar34 != local_38);
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != local_40);
      }
      if ((uVar30 == 0 && uVar3 == 1) && 0 < (int)_h) {
        iVar37 = top_blob->w;
        sVar8 = top_blob->elemsize;
        pvVar9 = top_blob->data;
        pp_Var6 = this->_vptr_Convolution1D_x86_fma;
        uVar46 = 0;
        do {
          pvVar25 = local_a8.data;
          if (-1 < iVar4) {
            lVar28 = (long)local_a8.w;
            lVar44 = CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize);
            uVar34 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar324 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar324 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) +
                                            uVar46 * 4));
              }
              auVar241 = auVar324._0_16_;
              if (0 < iVar26) {
                iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                puVar36 = (uint *)((long)((int)uVar46 * iVar26 * iVar50) * 4 +
                                  *(long *)(&this->field_0x148 + (long)p_Var5));
                puVar40 = (uint *)((long)(_func_int ***)pvVar25 +
                                  (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * (int)uVar34) *
                                  4);
                uVar39 = 0;
                do {
                  if (0 < iVar50) {
                    puVar49 = puVar40;
                    iVar27 = iVar50;
                    do {
                      auVar241 = vfmadd231ss_fma(auVar324._0_16_,ZEXT416(*puVar36),ZEXT416(*puVar49)
                                                );
                      auVar324 = ZEXT1664(auVar241);
                      puVar36 = puVar36 + 1;
                      puVar49 = puVar49 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                  auVar241 = auVar324._0_16_;
                  uVar39 = uVar39 + 1;
                  puVar40 = (uint *)((long)puVar40 + lVar28 * lVar44);
                } while (uVar39 != uVar51);
              }
              fVar56 = auVar241._0_4_;
              fVar57 = fVar56;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar241 = vmaxss_avx(auVar241,ZEXT416(0));
                fVar57 = auVar241._0_4_;
                break;
              case 2:
                auVar241 = vcmpss_avx(ZEXT816(0) << 0x40,auVar241,1);
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = 0x3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar241 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var5)),
                                         auVar205,auVar241);
                fVar57 = auVar241._0_4_ * fVar56;
                break;
              case 3:
                fVar56 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar241 = vmaxss_avx(auVar241,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var5)
                                                      ));
                fVar57 = auVar241._0_4_;
                if (fVar56 < auVar241._0_4_) {
                  fVar57 = fVar56;
                }
                break;
              case 4:
                auVar241 = vminss_avx(auVar241,ZEXT416(0x42b0c0a5));
                auVar135._0_8_ = auVar241._0_8_ ^ 0x8000000080000000;
                auVar135._8_4_ = auVar241._8_4_ ^ 0x80000000;
                auVar135._12_4_ = auVar241._12_4_ ^ 0x80000000;
                auVar241 = vcmpss_avx(auVar241,ZEXT416(0xc2b0c0a5),1);
                auVar204._8_4_ = 0x42b0c0a5;
                auVar204._0_8_ = 0x42b0c0a542b0c0a5;
                auVar204._12_4_ = 0x42b0c0a5;
                auVar241 = vblendvps_avx(auVar135,auVar204,auVar241);
                fVar57 = expf(auVar241._0_4_);
                fVar57 = 1.0 / (fVar57 + 1.0);
                break;
              case 5:
                fVar57 = expf(fVar56);
                fVar57 = logf(fVar57 + 1.0);
                fVar57 = tanhf(fVar57);
                fVar57 = fVar57 * fVar56;
                break;
              case 6:
                fVar480 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar2 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar240 = -fVar2 / fVar480;
                fVar57 = 0.0;
                if ((fVar240 <= fVar56) && (fVar57 = fVar56, fVar56 <= fVar240 + 1.0 / fVar480)) {
                  auVar241 = vfmadd213ss_fma(ZEXT416((uint)fVar480),auVar241,ZEXT416((uint)fVar2));
                  fVar57 = auVar241._0_4_ * fVar56;
                }
              }
              *(float *)((long)pvVar9 + uVar34 * 4 + (long)iVar37 * sVar8 * uVar46) = fVar57;
              uVar34 = uVar34 + 1;
            } while (uVar34 != local_38);
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != _h);
      }
      iVar50 = 0;
    }
  }
  piVar24 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_a8.data != (Allocator *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar50;
}

Assistant:

int Convolution1D_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}